

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  ulong uVar67;
  byte bVar68;
  ulong uVar69;
  undefined8 in_R10;
  long lVar70;
  bool bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar139;
  uint uVar140;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar142;
  uint uVar143;
  uint uVar144;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  uint uVar141;
  uint uVar145;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar146;
  vint4 bi_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar164;
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar167 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar221;
  float fVar222;
  vint4 ai_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar223;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar227;
  vint4 bi;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  vint4 ai;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [32];
  undefined1 auVar240 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar250;
  vint4 ai_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar249 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  float fVar259;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar266;
  undefined1 auVar262 [32];
  float fVar264;
  float fVar265;
  undefined1 auVar263 [64];
  float fVar267;
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  float s;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b04;
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 (*local_838) [32];
  Primitive *local_830;
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  RTCHitN local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar72 = (ulong)(byte)prim[1];
  fVar146 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar80 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar199._0_4_ = fVar146 * auVar80._0_4_;
  auVar199._4_4_ = fVar146 * auVar80._4_4_;
  auVar199._8_4_ = fVar146 * auVar80._8_4_;
  auVar199._12_4_ = fVar146 * auVar80._12_4_;
  auVar84._0_4_ = fVar146 * auVar79._0_4_;
  auVar84._4_4_ = fVar146 * auVar79._4_4_;
  auVar84._8_4_ = fVar146 * auVar79._8_4_;
  auVar84._12_4_ = fVar146 * auVar79._12_4_;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xd + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x12 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x13 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x14 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar275._4_4_ = auVar84._0_4_;
  auVar275._0_4_ = auVar84._0_4_;
  auVar275._8_4_ = auVar84._0_4_;
  auVar275._12_4_ = auVar84._0_4_;
  auVar82 = vshufps_avx(auVar84,auVar84,0x55);
  auVar83 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar146 = auVar83._0_4_;
  auVar228._0_4_ = fVar146 * auVar74._0_4_;
  fVar227 = auVar83._4_4_;
  auVar228._4_4_ = fVar227 * auVar74._4_4_;
  fVar198 = auVar83._8_4_;
  auVar228._8_4_ = fVar198 * auVar74._8_4_;
  fVar221 = auVar83._12_4_;
  auVar228._12_4_ = fVar221 * auVar74._12_4_;
  auVar165._0_4_ = auVar75._0_4_ * fVar146;
  auVar165._4_4_ = auVar75._4_4_ * fVar227;
  auVar165._8_4_ = auVar75._8_4_ * fVar198;
  auVar165._12_4_ = auVar75._12_4_ * fVar221;
  auVar147._0_4_ = auVar76._0_4_ * fVar146;
  auVar147._4_4_ = auVar76._4_4_ * fVar227;
  auVar147._8_4_ = auVar76._8_4_ * fVar198;
  auVar147._12_4_ = auVar76._12_4_ * fVar221;
  auVar83 = vfmadd231ps_fma(auVar228,auVar82,auVar79);
  auVar78 = vfmadd231ps_fma(auVar165,auVar82,auVar15);
  auVar82 = vfmadd231ps_fma(auVar147,auVar81,auVar82);
  auVar77 = vfmadd231ps_fma(auVar83,auVar275,auVar80);
  auVar78 = vfmadd231ps_fma(auVar78,auVar275,auVar14);
  auVar84 = vfmadd231ps_fma(auVar82,auVar85,auVar275);
  auVar276._4_4_ = auVar199._0_4_;
  auVar276._0_4_ = auVar199._0_4_;
  auVar276._8_4_ = auVar199._0_4_;
  auVar276._12_4_ = auVar199._0_4_;
  auVar82 = vshufps_avx(auVar199,auVar199,0x55);
  auVar83 = vshufps_avx(auVar199,auVar199,0xaa);
  auVar74 = vmulps_avx512vl(auVar83,auVar74);
  auVar200._0_4_ = auVar83._0_4_ * auVar75._0_4_;
  auVar200._4_4_ = auVar83._4_4_ * auVar75._4_4_;
  auVar200._8_4_ = auVar83._8_4_ * auVar75._8_4_;
  auVar200._12_4_ = auVar83._12_4_ * auVar75._12_4_;
  auVar183._0_4_ = auVar83._0_4_ * auVar76._0_4_;
  auVar183._4_4_ = auVar83._4_4_ * auVar76._4_4_;
  auVar183._8_4_ = auVar83._8_4_ * auVar76._8_4_;
  auVar183._12_4_ = auVar83._12_4_ * auVar76._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar82,auVar79);
  auVar79 = vfmadd231ps_fma(auVar200,auVar82,auVar15);
  auVar74 = vfmadd231ps_fma(auVar183,auVar82,auVar81);
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar276,auVar80);
  auVar75 = vfmadd231ps_fma(auVar79,auVar276,auVar14);
  auVar254._8_4_ = 0x7fffffff;
  auVar254._0_8_ = 0x7fffffff7fffffff;
  auVar254._12_4_ = 0x7fffffff;
  auVar81 = vfmadd231ps_fma(auVar74,auVar276,auVar85);
  auVar80 = vandps_avx(auVar77,auVar254);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar71 = (bool)((byte)uVar67 & 1);
  auVar83._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._0_4_;
  bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._4_4_;
  bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._8_4_;
  bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._12_4_;
  auVar80 = vandps_avx(auVar78,auVar254);
  uVar67 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar71 = (bool)((byte)uVar67 & 1);
  auVar77._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._0_4_;
  bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._4_4_;
  bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._8_4_;
  bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._12_4_;
  auVar80 = vandps_avx(auVar84,auVar254);
  uVar67 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar71 = (bool)((byte)uVar67 & 1);
  auVar78._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar84._0_4_;
  bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar84._4_4_;
  bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar84._8_4_;
  bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar84._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar83);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = 0x3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar83,auVar79,auVar245);
  auVar74 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar80 = vfnmadd213ps_fma(auVar77,auVar79,auVar245);
  auVar15 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar78);
  auVar80 = vfnmadd213ps_fma(auVar78,auVar79,auVar245);
  auVar85 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar76);
  auVar237._0_4_ = auVar74._0_4_ * auVar80._0_4_;
  auVar237._4_4_ = auVar74._4_4_ * auVar80._4_4_;
  auVar237._8_4_ = auVar74._8_4_ * auVar80._8_4_;
  auVar237._12_4_ = auVar74._12_4_ * auVar80._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar80 = vpmovsxwd_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar76);
  auVar229._0_4_ = auVar74._0_4_ * auVar80._0_4_;
  auVar229._4_4_ = auVar74._4_4_ * auVar80._4_4_;
  auVar229._8_4_ = auVar74._8_4_ * auVar80._8_4_;
  auVar229._12_4_ = auVar74._12_4_ * auVar80._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar72 * 0xe + 6);
  auVar80 = vpmovsxwd_avx(auVar74);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar75);
  auVar246._0_4_ = auVar15._0_4_ * auVar80._0_4_;
  auVar246._4_4_ = auVar15._4_4_ * auVar80._4_4_;
  auVar246._8_4_ = auVar15._8_4_ * auVar80._8_4_;
  auVar246._12_4_ = auVar15._12_4_ * auVar80._12_4_;
  auVar74 = vpbroadcastd_avx512vl();
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar80 = vpmovsxwd_avx(auVar14);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar75);
  auVar166._0_4_ = auVar15._0_4_ * auVar80._0_4_;
  auVar166._4_4_ = auVar15._4_4_ * auVar80._4_4_;
  auVar166._8_4_ = auVar15._8_4_ * auVar80._8_4_;
  auVar166._12_4_ = auVar15._12_4_ * auVar80._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar72 * 0x15 + 6);
  auVar80 = vpmovsxwd_avx(auVar15);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar201._0_4_ = auVar85._0_4_ * auVar80._0_4_;
  auVar201._4_4_ = auVar85._4_4_ * auVar80._4_4_;
  auVar201._8_4_ = auVar85._8_4_ * auVar80._8_4_;
  auVar201._12_4_ = auVar85._12_4_ * auVar80._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar80 = vpmovsxwd_avx(auVar75);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar148._0_4_ = auVar85._0_4_ * auVar80._0_4_;
  auVar148._4_4_ = auVar85._4_4_ * auVar80._4_4_;
  auVar148._8_4_ = auVar85._8_4_ * auVar80._8_4_;
  auVar148._12_4_ = auVar85._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar237,auVar229);
  auVar79 = vpminsd_avx(auVar246,auVar166);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar79 = vpminsd_avx(auVar201,auVar148);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar85._4_4_ = uVar164;
  auVar85._0_4_ = uVar164;
  auVar85._8_4_ = uVar164;
  auVar85._12_4_ = uVar164;
  auVar79 = vmaxps_avx512vl(auVar79,auVar85);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar80,auVar81);
  auVar80 = vpmaxsd_avx(auVar237,auVar229);
  auVar79 = vpmaxsd_avx(auVar246,auVar166);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar79 = vpmaxsd_avx(auVar201,auVar148);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar76._4_4_ = uVar164;
  auVar76._0_4_ = uVar164;
  auVar76._8_4_ = uVar164;
  auVar76._12_4_ = uVar164;
  auVar79 = vminps_avx512vl(auVar79,auVar76);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar82);
  uVar16 = vcmpps_avx512vl(local_560,auVar80,2);
  uVar18 = vpcmpgtd_avx512vl(auVar74,_DAT_01f4ad30);
  local_828 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar16 & 0xf & (byte)uVar18));
  local_838 = (undefined1 (*) [32])&local_3c0;
  local_540 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_830 = prim;
LAB_017f2594:
  if (local_828 == 0) {
    return;
  }
  lVar70 = 0;
  for (uVar67 = local_828; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar70 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar1].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar70 = *(long *)&pGVar4[1].time_range.upper;
  auVar80 = *(undefined1 (*) [16])(lVar70 + (long)p_Var5 * uVar67);
  auVar79 = *(undefined1 (*) [16])(lVar70 + (uVar67 + 1) * (long)p_Var5);
  local_828 = local_828 - 1 & local_828;
  if (local_828 != 0) {
    uVar69 = local_828 - 1 & local_828;
    for (uVar72 = local_828; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar69 != 0) {
      for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar271._4_4_ = uVar164;
  auVar271._0_4_ = uVar164;
  auVar271._8_4_ = uVar164;
  auVar271._12_4_ = uVar164;
  local_600._16_4_ = uVar164;
  local_600._0_16_ = auVar271;
  local_600._20_4_ = uVar164;
  local_600._24_4_ = uVar164;
  local_600._28_4_ = uVar164;
  uVar164 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar277._4_4_ = uVar164;
  auVar277._0_4_ = uVar164;
  auVar277._8_4_ = uVar164;
  auVar277._12_4_ = uVar164;
  local_4c0._16_4_ = uVar164;
  local_4c0._0_16_ = auVar277;
  local_4c0._20_4_ = uVar164;
  local_4c0._24_4_ = uVar164;
  local_4c0._28_4_ = uVar164;
  auVar74 = vunpcklps_avx(auVar271,auVar277);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar85 = auVar86._0_16_;
  local_7d0 = vinsertps_avx512f(auVar74,auVar85,0x28);
  auVar238._0_4_ = auVar80._0_4_ + auVar79._0_4_;
  auVar238._4_4_ = auVar80._4_4_ + auVar79._4_4_;
  auVar238._8_4_ = auVar80._8_4_ + auVar79._8_4_;
  auVar238._12_4_ = auVar80._12_4_ + auVar79._12_4_;
  auVar20._8_4_ = 0x3f000000;
  auVar20._0_8_ = 0x3f0000003f000000;
  auVar20._12_4_ = 0x3f000000;
  auVar74 = vmulps_avx512vl(auVar238,auVar20);
  auVar74 = vsubps_avx(auVar74,auVar14);
  auVar74 = vdpps_avx(auVar74,local_7d0,0x7f);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar269 = ZEXT1664(local_7e0);
  fVar146 = *(float *)(ray + k * 4 + 0x60);
  auVar270 = ZEXT464((uint)fVar146);
  auVar247._4_12_ = ZEXT812(0) << 0x20;
  auVar247._0_4_ = local_7e0._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar247);
  auVar15 = vfnmadd213ss_fma(auVar75,local_7e0,ZEXT416(0x40000000));
  local_320 = auVar74._0_4_ * auVar75._0_4_ * auVar15._0_4_;
  auVar248._4_4_ = local_320;
  auVar248._0_4_ = local_320;
  auVar248._8_4_ = local_320;
  auVar248._12_4_ = local_320;
  fStack_5b0 = local_320;
  _local_5c0 = auVar248;
  fStack_5ac = local_320;
  fStack_5a8 = local_320;
  fStack_5a4 = local_320;
  auVar74 = vfmadd231ps_fma(auVar14,local_7d0,auVar248);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar80 = vsubps_avx(auVar80,auVar74);
  auVar14 = vsubps_avx(*(undefined1 (*) [16])(lVar70 + (uVar67 + 2) * (long)p_Var5),auVar74);
  auVar258 = ZEXT1664(auVar14);
  auVar79 = vsubps_avx(auVar79,auVar74);
  auVar263 = ZEXT1664(auVar79);
  auVar74 = vsubps_avx(*(undefined1 (*) [16])(lVar70 + (uVar67 + 3) * (long)p_Var5),auVar74);
  auVar87 = vbroadcastss_avx512vl(auVar80);
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  local_760 = ZEXT1632(auVar80);
  auVar88 = vpermps_avx512vl(auVar100,local_760);
  auVar101._8_4_ = 2;
  auVar101._0_8_ = 0x200000002;
  auVar101._12_4_ = 2;
  auVar101._16_4_ = 2;
  auVar101._20_4_ = 2;
  auVar101._24_4_ = 2;
  auVar101._28_4_ = 2;
  auVar89 = vpermps_avx512vl(auVar101,local_760);
  auVar98._8_4_ = 3;
  auVar98._0_8_ = 0x300000003;
  auVar98._12_4_ = 3;
  auVar98._16_4_ = 3;
  auVar98._20_4_ = 3;
  auVar98._24_4_ = 3;
  auVar98._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar98,local_760);
  auVar91 = vbroadcastss_avx512vl(auVar79);
  local_7a0 = ZEXT1632(auVar79);
  auVar92 = vpermps_avx512vl(auVar100,local_7a0);
  auVar93 = vpermps_avx512vl(auVar101,local_7a0);
  auVar94 = vpermps_avx512vl(auVar98,local_7a0);
  auVar95 = vbroadcastss_avx512vl(auVar14);
  local_780 = ZEXT1632(auVar14);
  auVar96 = vpermps_avx512vl(auVar100,local_780);
  local_2a0 = vpermps_avx512vl(auVar101,local_780);
  local_220 = vpermps_avx2(auVar98,local_780);
  local_2c0 = auVar74._0_4_;
  _local_7c0 = ZEXT1632(auVar74);
  local_240 = vpermps_avx2(auVar100,_local_7c0);
  local_2e0 = vpermps_avx512vl(auVar101,_local_7c0);
  local_300 = vpermps_avx2(auVar98,_local_7c0);
  local_280._16_16_ = local_2e0._16_16_;
  local_280._0_16_ = vmulss_avx512f(auVar85,auVar85);
  auVar80 = vfmadd231ps_fma(ZEXT1632(local_280._0_16_),local_4c0,local_4c0);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_600,local_600);
  local_260._0_4_ = auVar80._0_4_;
  local_260._4_4_ = local_260._0_4_;
  local_260._8_4_ = local_260._0_4_;
  local_260._12_4_ = local_260._0_4_;
  local_260._16_4_ = local_260._0_4_;
  local_260._20_4_ = local_260._0_4_;
  local_260._24_4_ = local_260._0_4_;
  local_260._28_4_ = local_260._0_4_;
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar97);
  local_6f0 = ZEXT416((uint)local_320);
  local_320 = fVar146 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_4e0 = vpbroadcastd_avx512vl();
  uVar67 = 0;
  local_b04 = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar80 = vsqrtss_avx(local_7e0,local_7e0);
  auVar79 = vsqrtss_avx(local_7e0,local_7e0);
  local_550 = ZEXT816(0x3f80000000000000);
  auVar243 = ZEXT3264(_DAT_01f7b040);
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  do {
    auVar74 = vmovshdup_avx(local_550);
    auVar74 = vsubps_avx(auVar74,local_550);
    auVar155._0_4_ = auVar74._0_4_;
    fVar227 = auVar155._0_4_ * 0.04761905;
    uVar164 = local_550._0_4_;
    auVar234._4_4_ = uVar164;
    auVar234._0_4_ = uVar164;
    auVar234._8_4_ = uVar164;
    auVar234._12_4_ = uVar164;
    auVar234._16_4_ = uVar164;
    auVar234._20_4_ = uVar164;
    auVar234._24_4_ = uVar164;
    auVar234._28_4_ = uVar164;
    auVar155._4_4_ = auVar155._0_4_;
    auVar155._8_4_ = auVar155._0_4_;
    auVar155._12_4_ = auVar155._0_4_;
    auVar155._16_4_ = auVar155._0_4_;
    auVar155._20_4_ = auVar155._0_4_;
    auVar155._24_4_ = auVar155._0_4_;
    auVar155._28_4_ = auVar155._0_4_;
    auVar74 = vfmadd231ps_fma(auVar234,auVar155,auVar243._0_32_);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar97 = vsubps_avx512vl(auVar97,ZEXT1632(auVar74));
    fVar198 = auVar74._0_4_;
    fVar221 = auVar74._4_4_;
    fVar222 = auVar74._8_4_;
    fVar223 = auVar74._12_4_;
    fVar225 = auVar97._0_4_;
    fVar226 = auVar97._4_4_;
    fVar250 = auVar97._8_4_;
    fVar251 = auVar97._12_4_;
    fVar252 = auVar97._16_4_;
    fVar182 = auVar97._20_4_;
    fVar253 = auVar97._24_4_;
    auVar104._4_4_ = fVar226 * fVar226 * -fVar221;
    auVar104._0_4_ = fVar225 * fVar225 * -fVar198;
    auVar104._8_4_ = fVar250 * fVar250 * -fVar222;
    auVar104._12_4_ = fVar251 * fVar251 * -fVar223;
    auVar104._16_4_ = fVar252 * fVar252 * -0.0;
    auVar104._20_4_ = fVar182 * fVar182 * -0.0;
    auVar104._24_4_ = fVar253 * fVar253 * -0.0;
    auVar104._28_4_ = 0x80000000;
    auVar243._28_36_ = auVar258._28_36_;
    auVar243._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * fVar223,
                            CONCAT48(fVar222 * fVar222,CONCAT44(fVar221 * fVar221,fVar198 * fVar198)
                                    )));
    fVar259 = fVar198 * 3.0;
    fVar264 = fVar221 * 3.0;
    fVar265 = fVar222 * 3.0;
    fVar266 = fVar223 * 3.0;
    auVar258._28_36_ = auVar263._28_36_;
    auVar258._0_28_ = ZEXT1628(CONCAT412(fVar266,CONCAT48(fVar265,CONCAT44(fVar264,fVar259))));
    fVar267 = auVar263._28_4_ + -5.0;
    auVar119._0_4_ = (fVar259 + -5.0) * fVar198 * fVar198 + 2.0;
    auVar119._4_4_ = (fVar264 + -5.0) * fVar221 * fVar221 + 2.0;
    auVar119._8_4_ = (fVar265 + -5.0) * fVar222 * fVar222 + 2.0;
    auVar119._12_4_ = (fVar266 + -5.0) * fVar223 * fVar223 + 2.0;
    auVar119._16_4_ = 0x40000000;
    auVar119._20_4_ = 0x40000000;
    auVar119._24_4_ = 0x40000000;
    auVar119._28_4_ = 0x40000000;
    auVar263._0_4_ = fVar225 * fVar225;
    auVar263._4_4_ = fVar226 * fVar226;
    auVar263._8_4_ = fVar250 * fVar250;
    auVar263._12_4_ = fVar251 * fVar251;
    auVar263._16_4_ = fVar252 * fVar252;
    auVar263._20_4_ = fVar182 * fVar182;
    auVar263._28_36_ = auVar269._28_36_;
    auVar263._24_4_ = fVar253 * fVar253;
    auVar120._0_4_ = auVar263._0_4_ * (fVar225 * 3.0 + -5.0) + 2.0;
    auVar120._4_4_ = auVar263._4_4_ * (fVar226 * 3.0 + -5.0) + 2.0;
    auVar120._8_4_ = auVar263._8_4_ * (fVar250 * 3.0 + -5.0) + 2.0;
    auVar120._12_4_ = auVar263._12_4_ * (fVar251 * 3.0 + -5.0) + 2.0;
    auVar120._16_4_ = auVar263._16_4_ * (fVar252 * 3.0 + -5.0) + 2.0;
    auVar120._20_4_ = auVar263._20_4_ * (fVar182 * 3.0 + -5.0) + 2.0;
    auVar120._24_4_ = auVar263._24_4_ * (fVar253 * 3.0 + -5.0) + 2.0;
    auVar120._28_4_ = auVar270._28_4_ + -5.0 + 2.0;
    fVar224 = auVar97._28_4_;
    auVar105._4_4_ = fVar221 * fVar221 * -fVar226;
    auVar105._0_4_ = fVar198 * fVar198 * -fVar225;
    auVar105._8_4_ = fVar222 * fVar222 * -fVar250;
    auVar105._12_4_ = fVar223 * fVar223 * -fVar251;
    auVar105._16_4_ = -fVar252 * 0.0 * 0.0;
    auVar105._20_4_ = -fVar182 * 0.0 * 0.0;
    auVar105._24_4_ = -fVar253 * 0.0 * 0.0;
    auVar105._28_4_ = -fVar224;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar97 = vmulps_avx512vl(auVar104,auVar98);
    auVar99 = vmulps_avx512vl(auVar119,auVar98);
    auVar100 = vmulps_avx512vl(auVar120,auVar98);
    auVar101 = vmulps_avx512vl(auVar105,auVar98);
    auVar106._4_4_ = fStack_2bc * auVar101._4_4_;
    auVar106._0_4_ = local_2c0 * auVar101._0_4_;
    auVar106._8_4_ = fStack_2b8 * auVar101._8_4_;
    auVar106._12_4_ = fStack_2b4 * auVar101._12_4_;
    auVar106._16_4_ = fStack_2b0 * auVar101._16_4_;
    auVar106._20_4_ = fStack_2ac * auVar101._20_4_;
    auVar106._24_4_ = fStack_2a8 * auVar101._24_4_;
    auVar106._28_4_ = auVar120._28_4_;
    auVar102 = vmulps_avx512vl(local_240,auVar101);
    auVar103 = vmulps_avx512vl(local_2e0,auVar101);
    auVar108._4_4_ = local_300._4_4_ * auVar101._4_4_;
    auVar108._0_4_ = local_300._0_4_ * auVar101._0_4_;
    auVar108._8_4_ = local_300._8_4_ * auVar101._8_4_;
    auVar108._12_4_ = local_300._12_4_ * auVar101._12_4_;
    auVar108._16_4_ = local_300._16_4_ * auVar101._16_4_;
    auVar108._20_4_ = local_300._20_4_ * auVar101._20_4_;
    auVar108._24_4_ = local_300._24_4_ * auVar101._24_4_;
    auVar108._28_4_ = auVar101._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar95);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar96);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_2a0);
    auVar100 = vfmadd231ps_avx512vl(auVar108,local_220,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar91);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar92);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar93);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar99);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar87);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar88);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar89);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar97);
    auVar109._4_4_ = (fVar226 + fVar226) * fVar221;
    auVar109._0_4_ = (fVar225 + fVar225) * fVar198;
    auVar109._8_4_ = (fVar250 + fVar250) * fVar222;
    auVar109._12_4_ = (fVar251 + fVar251) * fVar223;
    auVar109._16_4_ = (fVar252 + fVar252) * 0.0;
    auVar109._20_4_ = (fVar182 + fVar182) * 0.0;
    auVar109._24_4_ = (fVar253 + fVar253) * 0.0;
    auVar109._28_4_ = auVar99._28_4_;
    auVar97 = vsubps_avx(auVar109,auVar263._0_32_);
    auVar121._0_28_ =
         ZEXT1628(CONCAT412((fVar223 + fVar223) * (fVar266 + -5.0) + fVar266 * fVar223,
                            CONCAT48((fVar222 + fVar222) * (fVar265 + -5.0) + fVar265 * fVar222,
                                     CONCAT44((fVar221 + fVar221) * (fVar264 + -5.0) +
                                              fVar264 * fVar221,
                                              (fVar198 + fVar198) * (fVar259 + -5.0) +
                                              fVar259 * fVar198))));
    auVar121._28_4_ = fVar267 + 0.0;
    auVar102._8_4_ = 0x40000000;
    auVar102._0_8_ = 0x4000000040000000;
    auVar102._12_4_ = 0x40000000;
    auVar102._16_4_ = 0x40000000;
    auVar102._20_4_ = 0x40000000;
    auVar102._24_4_ = 0x40000000;
    auVar102._28_4_ = 0x40000000;
    auVar100 = vaddps_avx512vl(auVar258._0_32_,auVar102);
    auVar110._4_4_ = (fVar226 + fVar226) * auVar100._4_4_;
    auVar110._0_4_ = (fVar225 + fVar225) * auVar100._0_4_;
    auVar110._8_4_ = (fVar250 + fVar250) * auVar100._8_4_;
    auVar110._12_4_ = (fVar251 + fVar251) * auVar100._12_4_;
    auVar110._16_4_ = (fVar252 + fVar252) * auVar100._16_4_;
    auVar110._20_4_ = (fVar182 + fVar182) * auVar100._20_4_;
    auVar110._24_4_ = (fVar253 + fVar253) * auVar100._24_4_;
    auVar110._28_4_ = auVar100._28_4_;
    auVar111._4_4_ = fVar226 * 3.0 * fVar226;
    auVar111._0_4_ = fVar225 * 3.0 * fVar225;
    auVar111._8_4_ = fVar250 * 3.0 * fVar250;
    auVar111._12_4_ = fVar251 * 3.0 * fVar251;
    auVar111._16_4_ = fVar252 * 3.0 * fVar252;
    auVar111._20_4_ = fVar182 * 3.0 * fVar182;
    auVar111._24_4_ = fVar253 * 3.0 * fVar253;
    auVar111._28_4_ = fVar224;
    auVar100 = vsubps_avx(auVar110,auVar111);
    auVar101 = vsubps_avx(auVar243._0_32_,auVar109);
    auVar97 = vmulps_avx512vl(auVar97,auVar98);
    auVar102 = vmulps_avx512vl(auVar121,auVar98);
    auVar100 = vmulps_avx512vl(auVar100,auVar98);
    auVar101 = vmulps_avx512vl(auVar101,auVar98);
    auVar112._4_4_ = fStack_2bc * auVar101._4_4_;
    auVar112._0_4_ = local_2c0 * auVar101._0_4_;
    auVar112._8_4_ = fStack_2b8 * auVar101._8_4_;
    auVar112._12_4_ = fStack_2b4 * auVar101._12_4_;
    auVar112._16_4_ = fStack_2b0 * auVar101._16_4_;
    auVar112._20_4_ = fStack_2ac * auVar101._20_4_;
    auVar112._24_4_ = fStack_2a8 * auVar101._24_4_;
    auVar112._28_4_ = fVar267;
    auVar98 = vmulps_avx512vl(local_240,auVar101);
    auVar107 = vmulps_avx512vl(local_2e0,auVar101);
    auVar113._4_4_ = local_300._4_4_ * auVar101._4_4_;
    auVar113._0_4_ = local_300._0_4_ * auVar101._0_4_;
    auVar113._8_4_ = local_300._8_4_ * auVar101._8_4_;
    auVar113._12_4_ = local_300._12_4_ * auVar101._12_4_;
    auVar113._16_4_ = local_300._16_4_ * auVar101._16_4_;
    auVar113._20_4_ = local_300._20_4_ * auVar101._20_4_;
    auVar113._24_4_ = local_300._24_4_ * auVar101._24_4_;
    auVar113._28_4_ = auVar101._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar112,auVar100,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar96);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_2a0);
    auVar100 = vfmadd231ps_avx512vl(auVar113,local_220,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,auVar93);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar87);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar88);
    auVar102 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar97);
    auVar125._4_4_ = auVar101._4_4_ * fVar227;
    auVar125._0_4_ = auVar101._0_4_ * fVar227;
    auVar125._8_4_ = auVar101._8_4_ * fVar227;
    auVar125._12_4_ = auVar101._12_4_ * fVar227;
    auVar125._16_4_ = auVar101._16_4_ * fVar227;
    auVar125._20_4_ = auVar101._20_4_ * fVar227;
    auVar125._24_4_ = auVar101._24_4_ * fVar227;
    auVar125._28_4_ = fVar224 + fVar224;
    auVar126._4_4_ = auVar98._4_4_ * fVar227;
    auVar126._0_4_ = auVar98._0_4_ * fVar227;
    auVar126._8_4_ = auVar98._8_4_ * fVar227;
    auVar126._12_4_ = auVar98._12_4_ * fVar227;
    auVar126._16_4_ = auVar98._16_4_ * fVar227;
    auVar126._20_4_ = auVar98._20_4_ * fVar227;
    auVar126._24_4_ = auVar98._24_4_ * fVar227;
    auVar126._28_4_ = auVar99._28_4_;
    auVar127._4_4_ = auVar102._4_4_ * fVar227;
    auVar127._0_4_ = auVar102._0_4_ * fVar227;
    auVar127._8_4_ = auVar102._8_4_ * fVar227;
    auVar127._12_4_ = auVar102._12_4_ * fVar227;
    auVar127._16_4_ = auVar102._16_4_ * fVar227;
    auVar127._20_4_ = auVar102._20_4_ * fVar227;
    auVar127._24_4_ = auVar102._24_4_ * fVar227;
    auVar127._28_4_ = 0;
    fVar198 = fVar227 * auVar97._0_4_;
    fVar221 = fVar227 * auVar97._4_4_;
    auVar117._4_4_ = fVar221;
    auVar117._0_4_ = fVar198;
    fVar222 = fVar227 * auVar97._8_4_;
    auVar117._8_4_ = fVar222;
    fVar223 = fVar227 * auVar97._12_4_;
    auVar117._12_4_ = fVar223;
    fVar224 = fVar227 * auVar97._16_4_;
    auVar117._16_4_ = fVar224;
    fVar225 = fVar227 * auVar97._20_4_;
    auVar117._20_4_ = fVar225;
    fVar226 = fVar227 * auVar97._24_4_;
    auVar117._24_4_ = fVar226;
    auVar117._28_4_ = fVar227;
    auVar74 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar109 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar269 = ZEXT3264(auVar109);
    auVar101 = ZEXT1632(auVar74);
    auVar110 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar101);
    auVar270 = ZEXT3264(auVar110);
    auVar122._0_4_ = auVar103._0_4_ + fVar198;
    auVar122._4_4_ = auVar103._4_4_ + fVar221;
    auVar122._8_4_ = auVar103._8_4_ + fVar222;
    auVar122._12_4_ = auVar103._12_4_ + fVar223;
    auVar122._16_4_ = auVar103._16_4_ + fVar224;
    auVar122._20_4_ = auVar103._20_4_ + fVar225;
    auVar122._24_4_ = auVar103._24_4_ + fVar226;
    auVar122._28_4_ = auVar103._28_4_ + fVar227;
    auVar97 = vmaxps_avx(auVar103,auVar122);
    auVar100 = vminps_avx(auVar103,auVar122);
    auVar103 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar101);
    auVar111 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar101);
    auVar112 = vpermt2ps_avx512vl(auVar126,_DAT_01fb9fc0,auVar101);
    auVar122 = ZEXT1632(auVar74);
    auVar113 = vpermt2ps_avx512vl(auVar127,_DAT_01fb9fc0,auVar122);
    auVar101 = vpermt2ps_avx512vl(auVar117,_DAT_01fb9fc0,auVar122);
    auVar107 = vsubps_avx512vl(auVar103,auVar101);
    auVar101 = vsubps_avx(auVar108,auVar104);
    auVar263 = ZEXT3264(auVar101);
    auVar98 = vsubps_avx(auVar109,auVar105);
    auVar258 = ZEXT3264(auVar98);
    auVar102 = vsubps_avx(auVar110,auVar106);
    auVar99 = vmulps_avx512vl(auVar98,auVar127);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar126,auVar102);
    auVar114 = vmulps_avx512vl(auVar102,auVar125);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar127,auVar101);
    auVar115 = vmulps_avx512vl(auVar101,auVar126);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar125,auVar98);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar99,auVar99);
    auVar99 = vmulps_avx512vl(auVar102,auVar102);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar115 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar101);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar99);
    auVar99 = vfmadd132ps_avx512vl(auVar99,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar99);
    auVar116 = vmulps_avx512vl(auVar98,auVar113);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar112,auVar102);
    auVar117 = vmulps_avx512vl(auVar102,auVar111);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar113,auVar101);
    auVar118 = vmulps_avx512vl(auVar101,auVar112);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar111,auVar98);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar99 = vmulps_avx512vl(auVar116,auVar99);
    auVar99 = vmaxps_avx512vl(auVar114,auVar99);
    auVar99 = vsqrtps_avx512vl(auVar99);
    auVar114 = vmaxps_avx512vl(auVar107,auVar103);
    auVar97 = vmaxps_avx512vl(auVar97,auVar114);
    auVar116 = vaddps_avx512vl(auVar99,auVar97);
    auVar97 = vminps_avx512vl(auVar107,auVar103);
    auVar97 = vminps_avx(auVar100,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar99);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar116,auVar103);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    auVar97 = vmulps_avx512vl(auVar97,auVar107);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vrsqrt14ps_avx512vl(auVar115);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar115,auVar114);
    fVar227 = auVar99._0_4_;
    fVar198 = auVar99._4_4_;
    fVar221 = auVar99._8_4_;
    fVar222 = auVar99._12_4_;
    fVar223 = auVar99._16_4_;
    fVar224 = auVar99._20_4_;
    fVar225 = auVar99._24_4_;
    auVar118._4_4_ = fVar198 * fVar198 * fVar198 * auVar103._4_4_;
    auVar118._0_4_ = fVar227 * fVar227 * fVar227 * auVar103._0_4_;
    auVar118._8_4_ = fVar221 * fVar221 * fVar221 * auVar103._8_4_;
    auVar118._12_4_ = fVar222 * fVar222 * fVar222 * auVar103._12_4_;
    auVar118._16_4_ = fVar223 * fVar223 * fVar223 * auVar103._16_4_;
    auVar118._20_4_ = fVar224 * fVar224 * fVar224 * auVar103._20_4_;
    auVar118._24_4_ = fVar225 * fVar225 * fVar225 * auVar103._24_4_;
    auVar118._28_4_ = auVar116._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar118,auVar99,auVar115);
    auVar103 = vmulps_avx512vl(auVar101,auVar99);
    auVar107 = vmulps_avx512vl(auVar98,auVar99);
    auVar114 = vmulps_avx512vl(auVar102,auVar99);
    auVar115 = vsubps_avx512vl(auVar122,auVar104);
    auVar117 = vsubps_avx512vl(auVar122,auVar105);
    auVar118 = vsubps_avx512vl(auVar122,auVar106);
    auVar116 = vmulps_avx512vl(auVar86,auVar118);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_4c0,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_600,auVar115);
    auVar119 = vmulps_avx512vl(auVar118,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar115);
    auVar120 = vmulps_avx512vl(auVar86,auVar114);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar107,local_4c0);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar103,local_600);
    auVar114 = vmulps_avx512vl(auVar118,auVar114);
    auVar107 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar107);
    auVar103 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar103);
    auVar107 = vmulps_avx512vl(auVar120,auVar120);
    auVar114 = vsubps_avx512vl(local_260,auVar107);
    auVar121 = vmulps_avx512vl(auVar120,auVar103);
    auVar116 = vsubps_avx512vl(auVar116,auVar121);
    auVar121 = vaddps_avx512vl(auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar103,auVar103);
    local_740 = vsubps_avx512vl(auVar119,auVar116);
    auVar100 = vsubps_avx512vl(local_740,auVar100);
    local_860 = vmulps_avx512vl(auVar121,auVar121);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    _local_620 = vmulps_avx512vl(auVar114,auVar116);
    auVar116 = vmulps_avx512vl(_local_620,auVar100);
    auVar116 = vsubps_avx512vl(local_860,auVar116);
    uVar72 = vcmpps_avx512vl(auVar116,auVar122,5);
    bVar62 = (byte)uVar72;
    if (bVar62 == 0) {
LAB_017f32c3:
      auVar243 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      local_640 = vaddps_avx512vl(auVar114,auVar114);
      local_660 = vrcp14ps_avx512vl(local_640);
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar30._16_4_ = 0x3f800000;
      auVar30._20_4_ = 0x3f800000;
      auVar30._24_4_ = 0x3f800000;
      auVar30._28_4_ = 0x3f800000;
      auVar119 = vfnmadd213ps_avx512vl(local_660,local_640,auVar30);
      auVar119 = vfmadd132ps_avx512vl(auVar119,local_660,local_660);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      local_680 = vxorps_avx512vl(auVar121,auVar31);
      auVar122 = vsubps_avx512vl(local_680,auVar116);
      local_880 = vmulps_avx512vl(auVar122,auVar119);
      auVar116 = vsubps_avx512vl(auVar116,auVar121);
      local_800 = vmulps_avx512vl(auVar116,auVar119);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar116,local_880);
      auVar123._0_4_ =
           (uint)(bVar62 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar116._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar71 * auVar119._4_4_ | (uint)!bVar71 * auVar116._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar71 * auVar119._8_4_ | (uint)!bVar71 * auVar116._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar71 * auVar119._12_4_ | (uint)!bVar71 * auVar116._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar71 * auVar119._16_4_ | (uint)!bVar71 * auVar116._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar71 * auVar119._20_4_ | (uint)!bVar71 * auVar116._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar71 * auVar119._24_4_ | (uint)!bVar71 * auVar116._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar123._28_4_ = (uint)bVar71 * auVar119._28_4_ | (uint)!bVar71 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar116,local_800);
      auVar124._0_4_ =
           (uint)(bVar62 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar116._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar71 * auVar119._4_4_ | (uint)!bVar71 * auVar116._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar71 * auVar119._8_4_ | (uint)!bVar71 * auVar116._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar71 * auVar119._12_4_ | (uint)!bVar71 * auVar116._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar71 * auVar119._16_4_ | (uint)!bVar71 * auVar116._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar71 * auVar119._20_4_ | (uint)!bVar71 * auVar116._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar71 * auVar119._24_4_ | (uint)!bVar71 * auVar116._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar124._28_4_ = (uint)bVar71 * auVar119._28_4_ | (uint)!bVar71 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar116);
      local_820 = vmaxps_avx512vl(local_280,auVar116);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_6a0 = vmulps_avx512vl(local_820,auVar32);
      vandps_avx512vl(auVar114,auVar116);
      uVar69 = vcmpps_avx512vl(local_6a0,local_6a0,1);
      uVar72 = uVar72 & uVar69;
      bVar68 = (byte)uVar72;
      if (bVar68 != 0) {
        uVar69 = vcmpps_avx512vl(auVar100,_DAT_01f7b000,2);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar100,auVar107);
        bVar66 = (byte)uVar69;
        uVar73 = (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * local_6a0._0_4_;
        bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
        uVar139 = (uint)bVar71 * auVar114._4_4_ | (uint)!bVar71 * local_6a0._4_4_;
        bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
        uVar140 = (uint)bVar71 * auVar114._8_4_ | (uint)!bVar71 * local_6a0._8_4_;
        bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
        uVar141 = (uint)bVar71 * auVar114._12_4_ | (uint)!bVar71 * local_6a0._12_4_;
        bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
        uVar142 = (uint)bVar71 * auVar114._16_4_ | (uint)!bVar71 * local_6a0._16_4_;
        bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
        uVar143 = (uint)bVar71 * auVar114._20_4_ | (uint)!bVar71 * local_6a0._20_4_;
        bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
        uVar144 = (uint)bVar71 * auVar114._24_4_ | (uint)!bVar71 * local_6a0._24_4_;
        bVar71 = SUB81(uVar69 >> 7,0);
        uVar145 = (uint)bVar71 * auVar114._28_4_ | (uint)!bVar71 * local_6a0._28_4_;
        auVar123._0_4_ = (bVar68 & 1) * uVar73 | !(bool)(bVar68 & 1) * auVar123._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar123._4_4_ = bVar71 * uVar139 | !bVar71 * auVar123._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar123._8_4_ = bVar71 * uVar140 | !bVar71 * auVar123._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar123._12_4_ = bVar71 * uVar141 | !bVar71 * auVar123._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar123._16_4_ = bVar71 * uVar142 | !bVar71 * auVar123._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar123._20_4_ = bVar71 * uVar143 | !bVar71 * auVar123._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar123._24_4_ = bVar71 * uVar144 | !bVar71 * auVar123._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar123._28_4_ = bVar71 * uVar145 | !bVar71 * auVar123._28_4_;
        auVar100 = vblendmps_avx512vl(auVar107,auVar100);
        bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar13 = SUB81(uVar69 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar66 & 1) * auVar100._0_4_ | !(bool)(bVar66 & 1) * uVar73) |
             !(bool)(bVar68 & 1) * auVar124._0_4_;
        bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar7 * ((uint)bVar71 * auVar100._4_4_ | !bVar71 * uVar139) |
             !bVar7 * auVar124._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar71 * ((uint)bVar8 * auVar100._8_4_ | !bVar8 * uVar140) |
             !bVar71 * auVar124._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar71 * ((uint)bVar9 * auVar100._12_4_ | !bVar9 * uVar141) |
             !bVar71 * auVar124._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar71 * ((uint)bVar10 * auVar100._16_4_ | !bVar10 * uVar142) |
             !bVar71 * auVar124._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar71 * ((uint)bVar11 * auVar100._20_4_ | !bVar11 * uVar143) |
             !bVar71 * auVar124._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar71 * ((uint)bVar12 * auVar100._24_4_ | !bVar12 * uVar144) |
             !bVar71 * auVar124._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar71 * ((uint)bVar13 * auVar100._28_4_ | !bVar13 * uVar145) |
             !bVar71 * auVar124._28_4_;
        bVar62 = (~bVar68 | bVar66) & bVar62;
      }
      if ((bVar62 & 0x7f) == 0) goto LAB_017f32c3;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar107 = vxorps_avx512vl(auVar113,auVar100);
      auVar114 = vxorps_avx512vl(auVar111,auVar100);
      auVar243 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar116 = vxorps_avx512vl(auVar112,auVar100);
      auVar74 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_6f0._0_4_));
      auVar111 = vbroadcastss_avx512vl(auVar74);
      auVar111 = vminps_avx512vl(auVar111,auVar124);
      auVar61._4_4_ = fStack_31c;
      auVar61._0_4_ = local_320;
      auVar61._8_4_ = fStack_318;
      auVar61._12_4_ = fStack_314;
      auVar61._16_4_ = fStack_310;
      auVar61._20_4_ = fStack_30c;
      auVar61._24_4_ = fStack_308;
      auVar61._28_4_ = fStack_304;
      auVar112 = vmaxps_avx512vl(auVar61,auVar123);
      auVar113 = vmulps_avx512vl(auVar118,auVar127);
      auVar113 = vfmadd213ps_avx512vl(auVar117,auVar126,auVar113);
      auVar74 = vfmadd213ps_fma(auVar115,auVar125,auVar113);
      auVar115 = vmulps_avx512vl(auVar86,auVar127);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_4c0,auVar126);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_600,auVar125);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar113);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar113,auVar125,1);
      auVar126 = vxorps_avx512vl(ZEXT1632(auVar74),auVar100);
      auVar127 = vrcp14ps_avx512vl(auVar115);
      auVar117 = vxorps_avx512vl(auVar115,auVar100);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar119 = vfnmadd213ps_avx512vl(auVar127,auVar115,auVar118);
      auVar74 = vfmadd132ps_fma(auVar119,auVar127,auVar127);
      fVar227 = auVar74._0_4_ * auVar126._0_4_;
      fVar198 = auVar74._4_4_ * auVar126._4_4_;
      auVar37._4_4_ = fVar198;
      auVar37._0_4_ = fVar227;
      fVar221 = auVar74._8_4_ * auVar126._8_4_;
      auVar37._8_4_ = fVar221;
      fVar222 = auVar74._12_4_ * auVar126._12_4_;
      auVar37._12_4_ = fVar222;
      fVar223 = auVar126._16_4_ * 0.0;
      auVar37._16_4_ = fVar223;
      fVar224 = auVar126._20_4_ * 0.0;
      auVar37._20_4_ = fVar224;
      fVar225 = auVar126._24_4_ * 0.0;
      auVar37._24_4_ = fVar225;
      auVar37._28_4_ = auVar126._28_4_;
      uVar18 = vcmpps_avx512vl(auVar115,auVar117,1);
      bVar68 = (byte)uVar16 | (byte)uVar18;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar37,auVar119);
      auVar128._0_4_ =
           (uint)(bVar68 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar127._0_4_;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar71 * auVar122._4_4_ | (uint)!bVar71 * auVar127._4_4_;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar71 * auVar122._8_4_ | (uint)!bVar71 * auVar127._8_4_;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar71 * auVar122._12_4_ | (uint)!bVar71 * auVar127._12_4_;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar71 * auVar122._16_4_ | (uint)!bVar71 * auVar127._16_4_;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar71 * auVar122._20_4_ | (uint)!bVar71 * auVar127._20_4_;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar71 * auVar122._24_4_ | (uint)!bVar71 * auVar127._24_4_;
      auVar128._28_4_ =
           (uint)(bVar68 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar127._28_4_;
      auVar127 = vmaxps_avx512vl(auVar112,auVar128);
      uVar18 = vcmpps_avx512vl(auVar115,auVar117,6);
      bVar68 = (byte)uVar16 | (byte)uVar18;
      auVar129._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar227;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar198;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar221;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar222;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar223;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar224;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar225;
      auVar129._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar126._28_4_;
      auVar115 = vminps_avx512vl(auVar111,auVar129);
      auVar74 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar74),auVar108);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar74),auVar109);
      auVar111 = ZEXT1632(auVar74);
      auVar110 = vsubps_avx512vl(auVar111,auVar110);
      auVar110 = vmulps_avx512vl(auVar110,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar110,auVar116,auVar109);
      auVar108 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar108);
      auVar107 = vmulps_avx512vl(auVar86,auVar107);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_4c0,auVar116);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_600,auVar114);
      vandps_avx512vl(auVar107,auVar113);
      uVar16 = vcmpps_avx512vl(auVar107,auVar125,1);
      auVar114 = vxorps_avx512vl(auVar108,auVar100);
      auVar116 = vrcp14ps_avx512vl(auVar107);
      auVar100 = vxorps_avx512vl(auVar107,auVar100);
      auVar270 = ZEXT3264(auVar100);
      auVar108 = vfnmadd213ps_avx512vl(auVar116,auVar107,auVar118);
      auVar74 = vfmadd132ps_fma(auVar108,auVar116,auVar116);
      fVar227 = auVar74._0_4_ * auVar114._0_4_;
      fVar198 = auVar74._4_4_ * auVar114._4_4_;
      auVar38._4_4_ = fVar198;
      auVar38._0_4_ = fVar227;
      fVar221 = auVar74._8_4_ * auVar114._8_4_;
      auVar38._8_4_ = fVar221;
      fVar222 = auVar74._12_4_ * auVar114._12_4_;
      auVar38._12_4_ = fVar222;
      fVar223 = auVar114._16_4_ * 0.0;
      auVar38._16_4_ = fVar223;
      fVar224 = auVar114._20_4_ * 0.0;
      auVar38._20_4_ = fVar224;
      fVar225 = auVar114._24_4_ * 0.0;
      auVar38._24_4_ = fVar225;
      auVar38._28_4_ = auVar114._28_4_;
      uVar18 = vcmpps_avx512vl(auVar107,auVar100,1);
      bVar68 = (byte)uVar16 | (byte)uVar18;
      auVar108 = vblendmps_avx512vl(auVar38,auVar119);
      auVar130._0_4_ =
           (uint)(bVar68 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar116._0_4_;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar71 * auVar108._4_4_ | (uint)!bVar71 * auVar116._4_4_;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar71 * auVar108._8_4_ | (uint)!bVar71 * auVar116._8_4_;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar71 * auVar108._12_4_ | (uint)!bVar71 * auVar116._12_4_;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar71 * auVar108._16_4_ | (uint)!bVar71 * auVar116._16_4_;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar71 * auVar108._20_4_ | (uint)!bVar71 * auVar116._20_4_;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar71 * auVar108._24_4_ | (uint)!bVar71 * auVar116._24_4_;
      auVar130._28_4_ =
           (uint)(bVar68 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar116._28_4_;
      local_5e0 = vmaxps_avx(auVar127,auVar130);
      auVar269 = ZEXT3264(local_5e0);
      uVar18 = vcmpps_avx512vl(auVar107,auVar100,6);
      bVar68 = (byte)uVar16 | (byte)uVar18;
      auVar131._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar227;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar198;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar221;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar222;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar223;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar224;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar225;
      auVar131._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar114._28_4_;
      local_360 = vminps_avx(auVar115,auVar131);
      uVar16 = vcmpps_avx512vl(local_5e0,local_360,2);
      bVar62 = bVar62 & 0x7f & (byte)uVar16;
      if (bVar62 == 0) goto LAB_017f32c3;
      auVar100 = vmaxps_avx512vl(auVar111,auVar97);
      auVar97 = vfmadd213ps_avx512vl(local_880,auVar120,auVar103);
      fVar227 = auVar99._0_4_;
      fVar198 = auVar99._4_4_;
      auVar39._4_4_ = fVar198 * auVar97._4_4_;
      auVar39._0_4_ = fVar227 * auVar97._0_4_;
      fVar221 = auVar99._8_4_;
      auVar39._8_4_ = fVar221 * auVar97._8_4_;
      fVar222 = auVar99._12_4_;
      auVar39._12_4_ = fVar222 * auVar97._12_4_;
      fVar223 = auVar99._16_4_;
      auVar39._16_4_ = fVar223 * auVar97._16_4_;
      fVar224 = auVar99._20_4_;
      auVar39._20_4_ = fVar224 * auVar97._20_4_;
      fVar225 = auVar99._24_4_;
      auVar39._24_4_ = fVar225 * auVar97._24_4_;
      auVar39._28_4_ = auVar97._28_4_;
      auVar97 = vfmadd213ps_avx512vl(local_800,auVar120,auVar103);
      auVar40._4_4_ = fVar198 * auVar97._4_4_;
      auVar40._0_4_ = fVar227 * auVar97._0_4_;
      auVar40._8_4_ = fVar221 * auVar97._8_4_;
      auVar40._12_4_ = fVar222 * auVar97._12_4_;
      auVar40._16_4_ = fVar223 * auVar97._16_4_;
      auVar40._20_4_ = fVar224 * auVar97._20_4_;
      auVar40._24_4_ = fVar225 * auVar97._24_4_;
      auVar40._28_4_ = auVar97._28_4_;
      auVar97 = vminps_avx512vl(auVar39,auVar118);
      auVar47 = ZEXT812(0);
      auVar107 = ZEXT1232(auVar47) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar47) << 0x20);
      auVar114 = vminps_avx512vl(auVar40,auVar118);
      auVar41._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar97._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar41,auVar155,auVar234);
      auVar97 = vmaxps_avx(auVar114,ZEXT1232(auVar47) << 0x20);
      auVar42._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar97._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar42,auVar155,auVar234);
      auVar43._4_4_ = auVar100._4_4_ * auVar100._4_4_;
      auVar43._0_4_ = auVar100._0_4_ * auVar100._0_4_;
      auVar43._8_4_ = auVar100._8_4_ * auVar100._8_4_;
      auVar43._12_4_ = auVar100._12_4_ * auVar100._12_4_;
      auVar43._16_4_ = auVar100._16_4_ * auVar100._16_4_;
      auVar43._20_4_ = auVar100._20_4_ * auVar100._20_4_;
      auVar43._24_4_ = auVar100._24_4_ * auVar100._24_4_;
      auVar43._28_4_ = auVar100._28_4_;
      auVar97 = vsubps_avx(local_740,auVar43);
      auVar44._4_4_ = auVar97._4_4_ * (float)local_620._4_4_;
      auVar44._0_4_ = auVar97._0_4_ * (float)local_620._0_4_;
      auVar44._8_4_ = auVar97._8_4_ * fStack_618;
      auVar44._12_4_ = auVar97._12_4_ * fStack_614;
      auVar44._16_4_ = auVar97._16_4_ * fStack_610;
      auVar44._20_4_ = auVar97._20_4_ * fStack_60c;
      auVar44._24_4_ = auVar97._24_4_ * fStack_608;
      auVar44._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(local_860,auVar44);
      uVar16 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar47) << 0x20,5);
      bVar68 = (byte)uVar16;
      if (bVar68 == 0) {
        bVar68 = 0;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar114 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar269 = ZEXT864(0) << 0x20;
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar132._16_4_ = 0x7f800000;
        auVar132._20_4_ = 0x7f800000;
        auVar132._24_4_ = 0x7f800000;
        auVar132._28_4_ = 0x7f800000;
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
      }
      else {
        uVar72 = vcmpps_avx512vl(auVar100,auVar111,5);
        auVar100 = vsqrtps_avx(auVar100);
        auVar107 = vfnmadd213ps_avx512vl(local_640,local_660,auVar118);
        auVar74 = vfmadd132ps_fma(auVar107,local_660,local_660);
        auVar107 = vsubps_avx(local_680,auVar100);
        auVar45._4_4_ = auVar74._4_4_ * auVar107._4_4_;
        auVar45._0_4_ = auVar74._0_4_ * auVar107._0_4_;
        auVar45._8_4_ = auVar74._8_4_ * auVar107._8_4_;
        auVar45._12_4_ = auVar74._12_4_ * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = 0x3e000000;
        auVar100 = vsubps_avx512vl(auVar100,auVar121);
        auVar46._4_4_ = auVar74._4_4_ * auVar100._4_4_;
        auVar46._0_4_ = auVar74._0_4_ * auVar100._0_4_;
        auVar46._8_4_ = auVar74._8_4_ * auVar100._8_4_;
        auVar46._12_4_ = auVar74._12_4_ * auVar100._12_4_;
        auVar46._16_4_ = auVar100._16_4_ * 0.0;
        auVar46._20_4_ = auVar100._20_4_ * 0.0;
        auVar46._24_4_ = auVar100._24_4_ * 0.0;
        auVar46._28_4_ = uVar164;
        auVar100 = vfmadd213ps_avx512vl(auVar120,auVar45,auVar103);
        auVar268._0_4_ = fVar227 * auVar100._0_4_;
        auVar268._4_4_ = fVar198 * auVar100._4_4_;
        auVar268._8_4_ = fVar221 * auVar100._8_4_;
        auVar268._12_4_ = fVar222 * auVar100._12_4_;
        auVar268._16_4_ = fVar223 * auVar100._16_4_;
        auVar268._20_4_ = fVar224 * auVar100._20_4_;
        auVar268._24_4_ = fVar225 * auVar100._24_4_;
        auVar268._28_4_ = 0;
        auVar100 = vmulps_avx512vl(local_600,auVar45);
        auVar107 = vmulps_avx512vl(local_4c0,auVar45);
        auVar115 = vmulps_avx512vl(auVar86,auVar45);
        auVar114 = vfmadd213ps_avx512vl(auVar101,auVar268,auVar104);
        auVar100 = vsubps_avx512vl(auVar100,auVar114);
        auVar114 = vfmadd213ps_avx512vl(auVar98,auVar268,auVar105);
        auVar114 = vsubps_avx512vl(auVar107,auVar114);
        auVar74 = vfmadd213ps_fma(auVar268,auVar102,auVar106);
        auVar107 = vsubps_avx(auVar115,ZEXT1632(auVar74));
        auVar269 = ZEXT3264(auVar107);
        auVar103 = vfmadd213ps_avx512vl(auVar120,auVar46,auVar103);
        auVar99 = vmulps_avx512vl(auVar99,auVar103);
        auVar103 = vmulps_avx512vl(local_600,auVar46);
        auVar115 = vmulps_avx512vl(local_4c0,auVar46);
        auVar116 = vmulps_avx512vl(auVar86,auVar46);
        auVar74 = vfmadd213ps_fma(auVar101,auVar99,auVar104);
        auVar107 = vsubps_avx(auVar103,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar98,auVar99,auVar105);
        auVar101 = vsubps_avx512vl(auVar115,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar102,auVar99,auVar106);
        auVar98 = vsubps_avx512vl(auVar116,ZEXT1632(auVar74));
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar102 = vblendmps_avx512vl(auVar156,auVar45);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar132._0_4_ = (uint)bVar71 * auVar102._0_4_ | (uint)!bVar71 * auVar104._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar71 * auVar102._4_4_ | (uint)!bVar71 * auVar104._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar71 * auVar102._8_4_ | (uint)!bVar71 * auVar104._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar71 * auVar102._12_4_ | (uint)!bVar71 * auVar104._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar71 * auVar102._16_4_ | (uint)!bVar71 * auVar104._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar71 * auVar102._20_4_ | (uint)!bVar71 * auVar104._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar71 * auVar102._24_4_ | (uint)!bVar71 * auVar104._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar132._28_4_ = (uint)bVar71 * auVar102._28_4_ | (uint)!bVar71 * auVar104._28_4_;
        auVar157._8_4_ = 0xff800000;
        auVar157._0_8_ = 0xff800000ff800000;
        auVar157._12_4_ = 0xff800000;
        auVar157._16_4_ = 0xff800000;
        auVar157._20_4_ = 0xff800000;
        auVar157._24_4_ = 0xff800000;
        auVar157._28_4_ = 0xff800000;
        auVar102 = vblendmps_avx512vl(auVar157,auVar46);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar133._0_4_ = (uint)bVar71 * auVar102._0_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar71 * auVar102._4_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar71 * auVar102._8_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar71 * auVar102._12_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar71 * auVar102._16_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar71 * auVar102._20_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar71 * auVar102._24_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar133._28_4_ = (uint)bVar71 * auVar102._28_4_ | (uint)!bVar71 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar102 = vmulps_avx512vl(local_820,auVar33);
        uVar69 = vcmpps_avx512vl(auVar102,local_6a0,0xe);
        uVar72 = uVar72 & uVar69;
        bVar66 = (byte)uVar72;
        if (bVar66 != 0) {
          uVar69 = vcmpps_avx512vl(auVar97,_DAT_01f7b000,2);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar262,auVar274);
          bVar63 = (byte)uVar69;
          uVar73 = (uint)(bVar63 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar102._0_4_;
          bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
          uVar139 = (uint)bVar71 * auVar97._4_4_ | (uint)!bVar71 * auVar102._4_4_;
          bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
          uVar140 = (uint)bVar71 * auVar97._8_4_ | (uint)!bVar71 * auVar102._8_4_;
          bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
          uVar141 = (uint)bVar71 * auVar97._12_4_ | (uint)!bVar71 * auVar102._12_4_;
          bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
          uVar142 = (uint)bVar71 * auVar97._16_4_ | (uint)!bVar71 * auVar102._16_4_;
          bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
          uVar143 = (uint)bVar71 * auVar97._20_4_ | (uint)!bVar71 * auVar102._20_4_;
          bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
          uVar144 = (uint)bVar71 * auVar97._24_4_ | (uint)!bVar71 * auVar102._24_4_;
          bVar71 = SUB81(uVar69 >> 7,0);
          uVar145 = (uint)bVar71 * auVar97._28_4_ | (uint)!bVar71 * auVar102._28_4_;
          auVar132._0_4_ = (bVar66 & 1) * uVar73 | !(bool)(bVar66 & 1) * auVar132._0_4_;
          bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar132._4_4_ = bVar71 * uVar139 | !bVar71 * auVar132._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar132._8_4_ = bVar71 * uVar140 | !bVar71 * auVar132._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar132._12_4_ = bVar71 * uVar141 | !bVar71 * auVar132._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar132._16_4_ = bVar71 * uVar142 | !bVar71 * auVar132._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar132._20_4_ = bVar71 * uVar143 | !bVar71 * auVar132._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar132._24_4_ = bVar71 * uVar144 | !bVar71 * auVar132._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar132._28_4_ = bVar71 * uVar145 | !bVar71 * auVar132._28_4_;
          auVar97 = vblendmps_avx512vl(auVar274,auVar262);
          bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar69 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          bVar13 = SUB81(uVar69 >> 7,0);
          auVar133._0_4_ =
               (uint)(bVar66 & 1) *
               ((uint)(bVar63 & 1) * auVar97._0_4_ | !(bool)(bVar63 & 1) * uVar73) |
               !(bool)(bVar66 & 1) * auVar133._0_4_;
          bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar133._4_4_ =
               (uint)bVar7 * ((uint)bVar71 * auVar97._4_4_ | !bVar71 * uVar139) |
               !bVar7 * auVar133._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar133._8_4_ =
               (uint)bVar71 * ((uint)bVar8 * auVar97._8_4_ | !bVar8 * uVar140) |
               !bVar71 * auVar133._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar133._12_4_ =
               (uint)bVar71 * ((uint)bVar9 * auVar97._12_4_ | !bVar9 * uVar141) |
               !bVar71 * auVar133._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar133._16_4_ =
               (uint)bVar71 * ((uint)bVar10 * auVar97._16_4_ | !bVar10 * uVar142) |
               !bVar71 * auVar133._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar133._20_4_ =
               (uint)bVar71 * ((uint)bVar11 * auVar97._20_4_ | !bVar11 * uVar143) |
               !bVar71 * auVar133._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar133._24_4_ =
               (uint)bVar71 * ((uint)bVar12 * auVar97._24_4_ | !bVar12 * uVar144) |
               !bVar71 * auVar133._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar133._28_4_ =
               (uint)bVar71 * ((uint)bVar13 * auVar97._28_4_ | !bVar13 * uVar145) |
               !bVar71 * auVar133._28_4_;
          bVar68 = (~bVar66 | bVar63) & bVar68;
        }
      }
      auVar97 = vmulps_avx512vl(auVar86,auVar98);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_4c0,auVar101);
      auVar263 = ZEXT3264(local_4c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_600,auVar107);
      auVar270 = ZEXT3264(local_5e0);
      _local_200 = local_5e0;
      local_1e0 = vminps_avx(local_360,auVar132);
      auVar257._8_4_ = 0x7fffffff;
      auVar257._0_8_ = 0x7fffffff7fffffff;
      auVar257._12_4_ = 0x7fffffff;
      auVar257._16_4_ = 0x7fffffff;
      auVar257._20_4_ = 0x7fffffff;
      auVar257._24_4_ = 0x7fffffff;
      auVar257._28_4_ = 0x7fffffff;
      auVar258 = ZEXT3264(auVar257);
      auVar97 = vandps_avx(auVar97,auVar257);
      _local_5a0 = vmaxps_avx(local_5e0,auVar133);
      _local_380 = _local_5a0;
      auVar249._8_4_ = 0x3e99999a;
      auVar249._0_8_ = 0x3e99999a3e99999a;
      auVar249._12_4_ = 0x3e99999a;
      auVar249._16_4_ = 0x3e99999a;
      auVar249._20_4_ = 0x3e99999a;
      auVar249._24_4_ = 0x3e99999a;
      auVar249._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar97,auVar249,1);
      uVar18 = vcmpps_avx512vl(local_5e0,local_1e0,2);
      bVar66 = (byte)uVar18 & bVar62;
      uVar17 = vcmpps_avx512vl(_local_5a0,local_360,2);
      if ((bVar62 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar243 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        bVar63 = (byte)uVar16 | ~bVar68;
        auVar97 = vmulps_avx512vl(auVar86,auVar269._0_32_);
        auVar74 = vfmadd213ps_fma(auVar114,local_4c0,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar100,local_600,ZEXT1632(auVar74));
        auVar97 = vandps_avx(auVar97,auVar257);
        uVar16 = vcmpps_avx512vl(auVar97,auVar249,1);
        bVar68 = (byte)uVar16 | ~bVar68;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar159,auVar34);
        local_340._0_4_ = (uint)(bVar68 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar71 = (bool)(bVar68 >> 1 & 1);
        local_340._4_4_ = (uint)bVar71 * auVar97._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 2 & 1);
        local_340._8_4_ = (uint)bVar71 * auVar97._8_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 3 & 1);
        local_340._12_4_ = (uint)bVar71 * auVar97._12_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 4 & 1);
        local_340._16_4_ = (uint)bVar71 * auVar97._16_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 5 & 1);
        local_340._20_4_ = (uint)bVar71 * auVar97._20_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 6 & 1);
        local_340._24_4_ = (uint)bVar71 * auVar97._24_4_ | (uint)!bVar71 * 2;
        local_340._28_4_ = (uint)(bVar68 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        local_520 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_520,local_340,5);
        local_580 = local_5e0._0_4_ + (float)local_5c0._0_4_;
        fStack_57c = local_5e0._4_4_ + (float)local_5c0._4_4_;
        fStack_578 = local_5e0._8_4_ + fStack_5b8;
        fStack_574 = local_5e0._12_4_ + fStack_5b4;
        fStack_570 = local_5e0._16_4_ + fStack_5b0;
        fStack_56c = local_5e0._20_4_ + fStack_5ac;
        fStack_568 = local_5e0._24_4_ + fStack_5a8;
        fStack_564 = local_5e0._28_4_ + fStack_5a4;
        for (bVar68 = (byte)uVar16 & bVar66; auVar136._16_16_ = auVar96._16_16_, bVar68 != 0;
            bVar68 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar68 & (byte)uVar16) {
          auVar160._8_4_ = 0x7f800000;
          auVar160._0_8_ = 0x7f8000007f800000;
          auVar160._12_4_ = 0x7f800000;
          auVar160._16_4_ = 0x7f800000;
          auVar160._20_4_ = 0x7f800000;
          auVar160._24_4_ = 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar160,local_5e0);
          auVar135._0_4_ =
               (uint)(bVar68 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar71 * auVar97._4_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar71 * auVar97._8_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar71 * auVar97._12_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar71 * auVar97._16_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar71 * auVar97._20_4_ | (uint)!bVar71 * 0x7f800000;
          auVar135._24_4_ =
               (uint)(bVar68 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar135,auVar135,0xb1);
          auVar97 = vminps_avx(auVar135,auVar97);
          auVar100 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar100);
          auVar100 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar100);
          uVar16 = vcmpps_avx512vl(auVar135,auVar97,0);
          bVar64 = (byte)uVar16 & bVar68;
          bVar65 = bVar68;
          if (bVar64 != 0) {
            bVar65 = bVar64;
          }
          iVar19 = 0;
          for (uVar73 = (uint)bVar65; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          uVar73 = *(uint *)(local_1a0 + (uint)(iVar19 << 2));
          uVar139 = *(uint *)(local_200 + (uint)(iVar19 << 2));
          fVar227 = auVar79._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar263 = ZEXT1664(auVar263._0_16_);
            auVar269 = ZEXT1664(auVar269._0_16_);
            auVar270 = ZEXT1664(auVar270._0_16_);
            fVar227 = sqrtf((float)local_7e0._0_4_);
          }
          auVar258 = ZEXT464(uVar139);
          auVar14 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar74 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar15 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar75 = vminps_avx(auVar14,auVar15);
          auVar14 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar15 = vmaxps_avx(auVar74,auVar14);
          auVar202._8_4_ = 0x7fffffff;
          auVar202._0_8_ = 0x7fffffff7fffffff;
          auVar202._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar75,auVar202);
          auVar14 = vandps_avx(auVar15,auVar202);
          auVar74 = vmaxps_avx(auVar74,auVar14);
          auVar14 = vmovshdup_avx(auVar74);
          auVar14 = vmaxss_avx(auVar14,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar14);
          fVar198 = auVar74._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar15,auVar15,0xff);
          auVar74 = vinsertps_avx(ZEXT416(uVar139),ZEXT416(uVar73),0x10);
          auVar243 = ZEXT1664(auVar74);
          lVar70 = 5;
          do {
            do {
              bVar71 = lVar70 == 0;
              lVar70 = lVar70 + -1;
              if (bVar71) goto LAB_017f3f91;
              uVar164 = auVar243._0_4_;
              auVar149._4_4_ = uVar164;
              auVar149._0_4_ = uVar164;
              auVar149._8_4_ = uVar164;
              auVar149._12_4_ = uVar164;
              auVar74 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_7d0);
              auVar14 = vmovshdup_avx(auVar243._0_16_);
              fVar250 = auVar14._0_4_;
              fVar226 = 1.0 - fVar250;
              fVar221 = fVar250 * fVar250;
              auVar76 = SUB6416(ZEXT464(0x40400000),0);
              auVar81 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar75 = vfmadd213ss_fma(auVar76,auVar14,auVar81);
              auVar15 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar221),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar226),auVar81);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar226 * fVar226)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar222 = fVar226 * fVar226 * -fVar250 * 0.5;
              fVar223 = auVar15._0_4_ * 0.5;
              fVar224 = auVar85._0_4_ * 0.5;
              fVar225 = fVar250 * fVar250 * -fVar226 * 0.5;
              auVar203._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar203._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar203._8_4_ = fVar225 * fStack_7b8;
              auVar203._12_4_ = fVar225 * fStack_7b4;
              auVar230._4_4_ = fVar224;
              auVar230._0_4_ = fVar224;
              auVar230._8_4_ = fVar224;
              auVar230._12_4_ = fVar224;
              auVar15 = vfmadd132ps_fma(auVar230,auVar203,local_780._0_16_);
              auVar184._4_4_ = fVar223;
              auVar184._0_4_ = fVar223;
              auVar184._8_4_ = fVar223;
              auVar184._12_4_ = fVar223;
              auVar15 = vfmadd132ps_fma(auVar184,auVar15,local_7a0._0_16_);
              auVar204._4_4_ = fVar222;
              auVar204._0_4_ = fVar222;
              auVar204._8_4_ = fVar222;
              auVar204._12_4_ = fVar222;
              auVar15 = vfmadd132ps_fma(auVar204,auVar15,local_760._0_16_);
              auVar85 = vfmadd231ss_fma(auVar81,auVar14,ZEXT416(0x41100000));
              local_640._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar14,ZEXT416(0x40800000));
              local_660._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(auVar76,auVar14,ZEXT416(0xbf800000));
              local_680._0_16_ = auVar85;
              _local_620 = auVar15;
              auVar15 = vsubps_avx(auVar74,auVar15);
              auVar74 = vdpps_avx(auVar15,auVar15,0x7f);
              fVar222 = auVar74._0_4_;
              local_740 = auVar243._0_32_;
              if (fVar222 < 0.0) {
                local_860._0_4_ = auVar75._0_4_;
                local_880._0_16_ = ZEXT416((uint)fVar226);
                local_800._0_4_ = fVar221;
                local_820._0_4_ = fVar226 * -2.0;
                auVar269._0_4_ = sqrtf(fVar222);
                auVar269._4_60_ = extraout_var;
                auVar75 = ZEXT416((uint)local_860._0_4_);
                auVar85 = auVar269._0_16_;
                auVar81 = local_880._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar74,auVar74);
                local_820._0_4_ = fVar226 * -2.0;
                local_800._0_4_ = fVar221;
                auVar81 = ZEXT416((uint)fVar226);
              }
              fVar221 = auVar81._0_4_;
              auVar82 = vfnmadd231ss_fma(ZEXT416((uint)(fVar250 * (fVar221 + fVar221))),auVar81,
                                         auVar81);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar250 + fVar250)),
                                        ZEXT416((uint)(fVar250 * fVar250 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar14,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221 * -3.0)),
                                        ZEXT416((uint)(fVar221 + fVar221)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar14,
                                        ZEXT416((uint)local_800._0_4_));
              fVar221 = auVar82._0_4_ * 0.5;
              fVar223 = auVar75._0_4_ * 0.5;
              fVar224 = auVar76._0_4_ * 0.5;
              fVar225 = auVar81._0_4_ * 0.5;
              auVar205._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar205._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar205._8_4_ = fVar225 * fStack_7b8;
              auVar205._12_4_ = fVar225 * fStack_7b4;
              auVar185._4_4_ = fVar224;
              auVar185._0_4_ = fVar224;
              auVar185._8_4_ = fVar224;
              auVar185._12_4_ = fVar224;
              auVar75 = vfmadd132ps_fma(auVar185,auVar205,local_780._0_16_);
              auVar168._4_4_ = fVar223;
              auVar168._0_4_ = fVar223;
              auVar168._8_4_ = fVar223;
              auVar168._12_4_ = fVar223;
              auVar75 = vfmadd132ps_fma(auVar168,auVar75,local_7a0._0_16_);
              auVar272._4_4_ = fVar221;
              auVar272._0_4_ = fVar221;
              auVar272._8_4_ = fVar221;
              auVar272._12_4_ = fVar221;
              local_860._0_16_ = vfmadd132ps_fma(auVar272,auVar75,local_760._0_16_);
              local_800._0_16_ = vdpps_avx(local_860._0_16_,local_860._0_16_,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar221 = local_800._0_4_;
              auVar75 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar221));
              fVar223 = auVar75._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar221));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_800._0_16_,auVar21);
              auVar75 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_6a0._0_4_ = auVar75._0_4_;
              local_880._0_4_ = auVar85._0_4_;
              if (fVar221 < auVar81._0_4_) {
                fVar224 = sqrtf(fVar221);
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar75 = local_860._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar224 = auVar75._0_4_;
                auVar75 = local_860._0_16_;
              }
              fVar221 = fVar223 * 1.5 + fVar221 * -0.5 * fVar223 * fVar223 * fVar223;
              auVar231._0_4_ = auVar75._0_4_ * fVar221;
              auVar231._4_4_ = auVar75._4_4_ * fVar221;
              auVar231._8_4_ = auVar75._8_4_ * fVar221;
              auVar231._12_4_ = auVar75._12_4_ * fVar221;
              auVar81 = vdpps_avx(auVar15,auVar231,0x7f);
              fVar226 = auVar85._0_4_;
              fVar223 = auVar81._0_4_;
              auVar150._0_4_ = fVar223 * fVar223;
              auVar150._4_4_ = auVar81._4_4_ * auVar81._4_4_;
              auVar150._8_4_ = auVar81._8_4_ * auVar81._8_4_;
              auVar150._12_4_ = auVar81._12_4_ * auVar81._12_4_;
              auVar76 = vsubps_avx512vl(auVar74,auVar150);
              fVar225 = auVar76._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar225;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar83 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
              if (fVar225 < 0.0) {
                local_6d0 = fVar221;
                fStack_6cc = fVar221;
                fStack_6c8 = fVar221;
                fStack_6c4 = fVar221;
                local_6c0 = auVar231;
                local_6b0 = auVar82;
                fVar225 = sqrtf(fVar225);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar231 = local_6c0;
                auVar76 = local_6b0;
                auVar75 = local_860._0_16_;
                fVar221 = local_6d0;
                fVar250 = fStack_6cc;
                fVar251 = fStack_6c8;
                fVar252 = fStack_6c4;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
                fVar225 = auVar76._0_4_;
                auVar76 = auVar82;
                fVar250 = fVar221;
                fVar251 = fVar221;
                fVar252 = fVar221;
              }
              auVar269 = ZEXT1664(auVar15);
              auVar170._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
              auVar170._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
              auVar170._8_4_ = (float)local_680._0_4_ * fStack_7b8;
              auVar170._12_4_ = (float)local_680._0_4_ * fStack_7b4;
              auVar186._4_4_ = local_660._0_4_;
              auVar186._0_4_ = local_660._0_4_;
              auVar186._8_4_ = local_660._0_4_;
              auVar186._12_4_ = local_660._0_4_;
              auVar78 = vfmadd132ps_fma(auVar186,auVar170,local_780._0_16_);
              auVar171._4_4_ = local_640._0_4_;
              auVar171._0_4_ = local_640._0_4_;
              auVar171._8_4_ = local_640._0_4_;
              auVar171._12_4_ = local_640._0_4_;
              auVar78 = vfmadd132ps_fma(auVar171,auVar78,local_7a0._0_16_);
              auVar14 = vfmadd213ss_fma(auVar14,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar164 = auVar14._0_4_;
              auVar187._4_4_ = uVar164;
              auVar187._0_4_ = uVar164;
              auVar187._8_4_ = uVar164;
              auVar187._12_4_ = uVar164;
              auVar14 = vfmadd132ps_fma(auVar187,auVar78,local_760._0_16_);
              auVar172._0_4_ = auVar14._0_4_ * (float)local_800._0_4_;
              auVar172._4_4_ = auVar14._4_4_ * (float)local_800._0_4_;
              auVar172._8_4_ = auVar14._8_4_ * (float)local_800._0_4_;
              auVar172._12_4_ = auVar14._12_4_ * (float)local_800._0_4_;
              auVar14 = vdpps_avx(auVar75,auVar14,0x7f);
              fVar182 = auVar14._0_4_;
              auVar188._0_4_ = auVar75._0_4_ * fVar182;
              auVar188._4_4_ = auVar75._4_4_ * fVar182;
              auVar188._8_4_ = auVar75._8_4_ * fVar182;
              auVar188._12_4_ = auVar75._12_4_ * fVar182;
              auVar14 = vsubps_avx(auVar172,auVar188);
              fVar182 = (float)local_6a0._0_4_ * (float)local_820._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar198),
                                   ZEXT416((uint)(local_740._0_4_ * fVar227 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar75,auVar22);
              auVar189._0_4_ = fVar221 * auVar14._0_4_ * fVar182;
              auVar189._4_4_ = fVar250 * auVar14._4_4_ * fVar182;
              auVar189._8_4_ = fVar251 * auVar14._8_4_ * fVar182;
              auVar189._12_4_ = fVar252 * auVar14._12_4_ * fVar182;
              auVar14 = vdpps_avx(auVar84,auVar231,0x7f);
              auVar77 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar198),auVar78);
              auVar85 = vdpps_avx(auVar15,auVar189,0x7f);
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                        ZEXT416((uint)(fVar198 / fVar224)),auVar77);
              fVar221 = auVar14._0_4_ + auVar85._0_4_;
              auVar270 = ZEXT464((uint)fVar221);
              auVar14 = vdpps_avx(local_7d0,auVar231,0x7f);
              auVar85 = vdpps_avx(auVar15,auVar84,0x7f);
              auVar83 = vmulss_avx512f(auVar83,auVar76);
              fVar224 = auVar82._0_4_ * 1.5 + auVar83._0_4_ * auVar76._0_4_ * auVar76._0_4_;
              auVar76 = vdpps_avx(auVar15,local_7d0,0x7f);
              auVar83 = vfnmadd231ss_fma(auVar85,auVar81,ZEXT416((uint)fVar221));
              auVar76 = vfnmadd231ss_fma(auVar76,auVar81,auVar14);
              auVar85 = vpermilps_avx(_local_620,0xff);
              fVar225 = fVar225 - auVar85._0_4_;
              auVar82 = vshufps_avx(auVar75,auVar75,0xff);
              auVar85 = vfmsub213ss_fma(auVar83,ZEXT416((uint)fVar224),auVar82);
              auVar260._8_4_ = 0x80000000;
              auVar260._0_8_ = 0x8000000080000000;
              auVar260._12_4_ = 0x80000000;
              auVar263 = ZEXT1664(auVar260);
              auVar255._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar258 = ZEXT1664(auVar255);
              auVar76 = ZEXT416((uint)(auVar76._0_4_ * fVar224));
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar221),auVar76);
              auVar85 = vinsertps_avx(auVar255,auVar76,0x1c);
              auVar239._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar14._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar14._12_4_ ^ 0x80000000;
              auVar76 = vinsertps_avx(ZEXT416((uint)fVar221),auVar239,0x10);
              auVar206._0_4_ = auVar83._0_4_;
              auVar206._4_4_ = auVar206._0_4_;
              auVar206._8_4_ = auVar206._0_4_;
              auVar206._12_4_ = auVar206._0_4_;
              auVar14 = vdivps_avx(auVar85,auVar206);
              auVar85 = vdivps_avx(auVar76,auVar206);
              auVar207._0_4_ = fVar223 * auVar14._0_4_ + fVar225 * auVar85._0_4_;
              auVar207._4_4_ = fVar223 * auVar14._4_4_ + fVar225 * auVar85._4_4_;
              auVar207._8_4_ = fVar223 * auVar14._8_4_ + fVar225 * auVar85._8_4_;
              auVar207._12_4_ = fVar223 * auVar14._12_4_ + fVar225 * auVar85._12_4_;
              auVar14 = vsubps_avx(local_740._0_16_,auVar207);
              auVar243 = ZEXT1664(auVar14);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(auVar81,auVar23);
            } while (auVar77._0_4_ <= auVar85._0_4_);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ + auVar78._0_4_)),local_6e0,
                                      ZEXT416(0x36000000));
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar24);
          } while (auVar85._0_4_ <= auVar81._0_4_);
          fVar227 = auVar14._0_4_ + (float)local_6f0._0_4_;
          if ((fVar146 <= fVar227) &&
             (fVar198 = *(float *)(ray + k * 4 + 0x100), fVar227 <= fVar198)) {
            auVar85 = vmovshdup_avx(auVar14);
            fVar223 = auVar85._0_4_;
            if ((0.0 <= fVar223) && (fVar223 <= 1.0)) {
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT412(0);
              auVar136._4_12_ = ZEXT412(0);
              auVar136._0_4_ = fVar222;
              auVar85 = vrsqrt14ss_avx512f(auVar49 << 0x20,auVar136._0_16_);
              fVar222 = auVar85._0_4_;
              auVar74 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
              pGVar4 = (context->scene->geometries).items[uVar1].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar222 = fVar222 * 1.5 + auVar74._0_4_ * fVar222 * fVar222 * fVar222;
                auVar208._0_4_ = auVar15._0_4_ * fVar222;
                auVar208._4_4_ = auVar15._4_4_ * fVar222;
                auVar208._8_4_ = auVar15._8_4_ * fVar222;
                auVar208._12_4_ = auVar15._12_4_ * fVar222;
                auVar81 = vfmadd213ps_fma(auVar82,auVar208,auVar75);
                auVar74 = vshufps_avx(auVar208,auVar208,0xc9);
                auVar85 = vshufps_avx(auVar75,auVar75,0xc9);
                auVar209._0_4_ = auVar208._0_4_ * auVar85._0_4_;
                auVar209._4_4_ = auVar208._4_4_ * auVar85._4_4_;
                auVar209._8_4_ = auVar208._8_4_ * auVar85._8_4_;
                auVar209._12_4_ = auVar208._12_4_ * auVar85._12_4_;
                auVar85 = vfmsub231ps_fma(auVar209,auVar75,auVar74);
                auVar74 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar75 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                auVar151._0_4_ = auVar81._0_4_ * auVar85._0_4_;
                auVar151._4_4_ = auVar81._4_4_ * auVar85._4_4_;
                auVar151._8_4_ = auVar81._8_4_ * auVar85._8_4_;
                auVar151._12_4_ = auVar81._12_4_ * auVar85._12_4_;
                auVar74 = vfmsub231ps_fma(auVar151,auVar74,auVar75);
                uVar164 = auVar74._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  uVar3 = vextractps_avx(auVar74,1);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                  uVar3 = vextractps_avx(auVar74,2);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar164;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar223;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = uVar2;
                  *(uint *)(ray + k * 4 + 0x240) = uVar1;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  pRVar6 = context->user;
                  auVar218._8_4_ = 1;
                  auVar218._0_8_ = 0x100000001;
                  auVar218._12_4_ = 1;
                  auVar218._16_4_ = 1;
                  auVar218._20_4_ = 1;
                  auVar218._24_4_ = 1;
                  auVar218._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar218,ZEXT1632(auVar14));
                  auVar97 = vpermps_avx2(auVar218,ZEXT1632(auVar74));
                  auVar235._8_4_ = 2;
                  auVar235._0_8_ = 0x200000002;
                  auVar235._12_4_ = 2;
                  auVar235._16_4_ = 2;
                  auVar235._20_4_ = 2;
                  auVar235._24_4_ = 2;
                  auVar235._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar235,ZEXT1632(auVar74));
                  local_4a0[0] = (RTCHitN)auVar97[0];
                  local_4a0[1] = (RTCHitN)auVar97[1];
                  local_4a0[2] = (RTCHitN)auVar97[2];
                  local_4a0[3] = (RTCHitN)auVar97[3];
                  local_4a0[4] = (RTCHitN)auVar97[4];
                  local_4a0[5] = (RTCHitN)auVar97[5];
                  local_4a0[6] = (RTCHitN)auVar97[6];
                  local_4a0[7] = (RTCHitN)auVar97[7];
                  local_4a0[8] = (RTCHitN)auVar97[8];
                  local_4a0[9] = (RTCHitN)auVar97[9];
                  local_4a0[10] = (RTCHitN)auVar97[10];
                  local_4a0[0xb] = (RTCHitN)auVar97[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar97[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar97[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar97[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar97[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar97[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar97[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar97[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar97[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar97[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar97[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar97[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar97[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar97[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar97[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar97[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar97[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar97[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar97[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar97[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar97[0x1f];
                  local_460 = uVar164;
                  uStack_45c = uVar164;
                  uStack_458 = uVar164;
                  uStack_454 = uVar164;
                  uStack_450 = uVar164;
                  uStack_44c = uVar164;
                  uStack_448 = uVar164;
                  uStack_444 = uVar164;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_500._0_8_;
                  uStack_3f8 = local_500._8_8_;
                  uStack_3f0 = local_500._16_8_;
                  uStack_3e8 = local_500._24_8_;
                  local_3e0 = local_4e0;
                  auVar97 = vpcmpeqd_avx2(local_4e0,local_4e0);
                  local_838[1] = auVar97;
                  *local_838 = auVar97;
                  local_3c0 = pRVar6->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar6->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  local_720 = local_540;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_4a0;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar258 = ZEXT1664(auVar255);
                    auVar263 = ZEXT1664(auVar260);
                    auVar269 = ZEXT1664(auVar15);
                    auVar270 = ZEXT1664(ZEXT416((uint)fVar221));
                    (*pGVar4->intersectionFilterN)(&local_8b0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      (*p_Var5)(&local_8b0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      iVar52 = *(int *)(local_8b0.hit + 4);
                      iVar53 = *(int *)(local_8b0.hit + 8);
                      iVar54 = *(int *)(local_8b0.hit + 0xc);
                      iVar55 = *(int *)(local_8b0.hit + 0x10);
                      iVar56 = *(int *)(local_8b0.hit + 0x14);
                      iVar57 = *(int *)(local_8b0.hit + 0x18);
                      iVar58 = *(int *)(local_8b0.hit + 0x1c);
                      bVar65 = (byte)uVar72;
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x180) =
                           (uint)(bVar65 & 1) * *(int *)local_8b0.hit |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_8b0.ray + 0x180);
                      *(uint *)(local_8b0.ray + 0x184) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x184);
                      *(uint *)(local_8b0.ray + 0x188) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x188);
                      *(uint *)(local_8b0.ray + 0x18c) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x18c);
                      *(uint *)(local_8b0.ray + 400) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 400);
                      *(uint *)(local_8b0.ray + 0x194) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x194);
                      *(uint *)(local_8b0.ray + 0x198) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x198);
                      *(uint *)(local_8b0.ray + 0x19c) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x19c);
                      iVar52 = *(int *)(local_8b0.hit + 0x24);
                      iVar53 = *(int *)(local_8b0.hit + 0x28);
                      iVar54 = *(int *)(local_8b0.hit + 0x2c);
                      iVar55 = *(int *)(local_8b0.hit + 0x30);
                      iVar56 = *(int *)(local_8b0.hit + 0x34);
                      iVar57 = *(int *)(local_8b0.hit + 0x38);
                      iVar58 = *(int *)(local_8b0.hit + 0x3c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1a0) =
                           (uint)(bVar65 & 1) * *(int *)(local_8b0.hit + 0x20) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_8b0.ray + 0x1a0);
                      *(uint *)(local_8b0.ray + 0x1a4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1a4);
                      *(uint *)(local_8b0.ray + 0x1a8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1a8);
                      *(uint *)(local_8b0.ray + 0x1ac) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1ac);
                      *(uint *)(local_8b0.ray + 0x1b0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1b0);
                      *(uint *)(local_8b0.ray + 0x1b4) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x1b4);
                      *(uint *)(local_8b0.ray + 0x1b8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1b8);
                      *(uint *)(local_8b0.ray + 0x1bc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1bc);
                      iVar52 = *(int *)(local_8b0.hit + 0x44);
                      iVar53 = *(int *)(local_8b0.hit + 0x48);
                      iVar54 = *(int *)(local_8b0.hit + 0x4c);
                      iVar55 = *(int *)(local_8b0.hit + 0x50);
                      iVar56 = *(int *)(local_8b0.hit + 0x54);
                      iVar57 = *(int *)(local_8b0.hit + 0x58);
                      iVar58 = *(int *)(local_8b0.hit + 0x5c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1c0) =
                           (uint)(bVar65 & 1) * *(int *)(local_8b0.hit + 0x40) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_8b0.ray + 0x1c0);
                      *(uint *)(local_8b0.ray + 0x1c4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1c4);
                      *(uint *)(local_8b0.ray + 0x1c8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1c8);
                      *(uint *)(local_8b0.ray + 0x1cc) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1cc);
                      *(uint *)(local_8b0.ray + 0x1d0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1d0);
                      *(uint *)(local_8b0.ray + 0x1d4) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x1d4);
                      *(uint *)(local_8b0.ray + 0x1d8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1d8);
                      *(uint *)(local_8b0.ray + 0x1dc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1dc);
                      iVar52 = *(int *)(local_8b0.hit + 100);
                      iVar53 = *(int *)(local_8b0.hit + 0x68);
                      iVar54 = *(int *)(local_8b0.hit + 0x6c);
                      iVar55 = *(int *)(local_8b0.hit + 0x70);
                      iVar56 = *(int *)(local_8b0.hit + 0x74);
                      iVar57 = *(int *)(local_8b0.hit + 0x78);
                      iVar58 = *(int *)(local_8b0.hit + 0x7c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1e0) =
                           (uint)(bVar65 & 1) * *(int *)(local_8b0.hit + 0x60) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_8b0.ray + 0x1e0);
                      *(uint *)(local_8b0.ray + 0x1e4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1e4);
                      *(uint *)(local_8b0.ray + 0x1e8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1e8);
                      *(uint *)(local_8b0.ray + 0x1ec) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1ec);
                      *(uint *)(local_8b0.ray + 0x1f0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1f0);
                      *(uint *)(local_8b0.ray + 500) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 500);
                      *(uint *)(local_8b0.ray + 0x1f8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1f8);
                      *(uint *)(local_8b0.ray + 0x1fc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1fc);
                      iVar52 = *(int *)(local_8b0.hit + 0x84);
                      iVar53 = *(int *)(local_8b0.hit + 0x88);
                      iVar54 = *(int *)(local_8b0.hit + 0x8c);
                      iVar55 = *(int *)(local_8b0.hit + 0x90);
                      iVar56 = *(int *)(local_8b0.hit + 0x94);
                      iVar57 = *(int *)(local_8b0.hit + 0x98);
                      iVar58 = *(int *)(local_8b0.hit + 0x9c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x200) =
                           (uint)(bVar65 & 1) * *(int *)(local_8b0.hit + 0x80) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_8b0.ray + 0x200);
                      *(uint *)(local_8b0.ray + 0x204) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x204);
                      *(uint *)(local_8b0.ray + 0x208) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x208);
                      *(uint *)(local_8b0.ray + 0x20c) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x20c);
                      *(uint *)(local_8b0.ray + 0x210) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x210);
                      *(uint *)(local_8b0.ray + 0x214) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x214);
                      *(uint *)(local_8b0.ray + 0x218) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x218);
                      *(uint *)(local_8b0.ray + 0x21c) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x21c);
                      auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar97;
                      auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar97;
                      auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar97;
                      auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar97;
                      goto LAB_017f3f91;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar198;
                }
              }
            }
          }
LAB_017f3f91:
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar241._4_4_ = uVar164;
          auVar241._0_4_ = uVar164;
          auVar241._8_4_ = uVar164;
          auVar241._12_4_ = uVar164;
          auVar241._16_4_ = uVar164;
          auVar241._20_4_ = uVar164;
          auVar241._24_4_ = uVar164;
          auVar241._28_4_ = uVar164;
          auVar243 = ZEXT3264(auVar241);
          auVar59._4_4_ = fStack_57c;
          auVar59._0_4_ = local_580;
          auVar59._8_4_ = fStack_578;
          auVar59._12_4_ = fStack_574;
          auVar59._16_4_ = fStack_570;
          auVar59._20_4_ = fStack_56c;
          auVar59._24_4_ = fStack_568;
          auVar59._28_4_ = fStack_564;
          uVar16 = vcmpps_avx512vl(auVar241,auVar59,0xd);
        }
        auVar161._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
        auVar161._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
        auVar161._8_4_ = fStack_5b8 + fStack_598;
        auVar161._12_4_ = fStack_5b4 + fStack_594;
        auVar161._16_4_ = fStack_5b0 + fStack_590;
        auVar161._20_4_ = fStack_5ac + fStack_58c;
        auVar161._24_4_ = fStack_5a8 + fStack_588;
        auVar161._28_4_ = fStack_5a4 + fStack_584;
        uVar164 = auVar243._0_4_;
        auVar180._4_4_ = uVar164;
        auVar180._0_4_ = uVar164;
        auVar180._8_4_ = uVar164;
        auVar180._12_4_ = uVar164;
        auVar180._16_4_ = uVar164;
        auVar180._20_4_ = uVar164;
        auVar180._24_4_ = uVar164;
        auVar180._28_4_ = uVar164;
        uVar16 = vcmpps_avx512vl(auVar161,auVar180,2);
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar162,auVar35);
        local_5a0._0_4_ = (uint)(bVar63 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar71 = (bool)(bVar63 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar71 * auVar97._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar63 >> 2 & 1);
        fStack_598 = (float)((uint)bVar71 * auVar97._8_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar63 >> 3 & 1);
        fStack_594 = (float)((uint)bVar71 * auVar97._12_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar63 >> 4 & 1);
        fStack_590 = (float)((uint)bVar71 * auVar97._16_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar63 >> 5 & 1);
        fStack_58c = (float)((uint)bVar71 * auVar97._20_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar63 >> 6 & 1);
        fStack_588 = (float)((uint)bVar71 * auVar97._24_4_ | (uint)!bVar71 * 2);
        fStack_584 = (float)((uint)(bVar63 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2);
        bVar62 = (byte)uVar17 & bVar62 & (byte)uVar16;
        uVar16 = vpcmpd_avx512vl(_local_5a0,local_520,2);
        local_5e0 = _local_380;
        local_580 = (float)local_5c0._0_4_ + (float)local_380._0_4_;
        fStack_57c = (float)local_5c0._4_4_ + (float)local_380._4_4_;
        fStack_578 = fStack_5b8 + fStack_378;
        fStack_574 = fStack_5b4 + fStack_374;
        fStack_570 = fStack_5b0 + fStack_370;
        fStack_56c = fStack_5ac + fStack_36c;
        fStack_568 = fStack_5a8 + fStack_368;
        fStack_564 = fStack_5a4 + fStack_364;
        for (bVar68 = (byte)uVar16 & bVar62; bVar68 != 0;
            bVar68 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar68 & (byte)uVar16) {
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar163,local_5e0);
          auVar137._0_4_ =
               (uint)(bVar68 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar71 * auVar97._4_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar71 * auVar97._8_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar71 * auVar97._12_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar71 * auVar97._16_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar71 * auVar97._20_4_ | (uint)!bVar71 * 0x7f800000;
          auVar137._24_4_ =
               (uint)(bVar68 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
          auVar137._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar137,auVar137,0xb1);
          auVar97 = vminps_avx(auVar137,auVar97);
          auVar100 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar100);
          auVar100 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar100);
          uVar16 = vcmpps_avx512vl(auVar137,auVar97,0);
          bVar65 = (byte)uVar16 & bVar68;
          bVar63 = bVar68;
          if (bVar65 != 0) {
            bVar63 = bVar65;
          }
          iVar19 = 0;
          for (uVar73 = (uint)bVar63; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          uVar73 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
          uVar139 = *(uint *)(local_360 + (uint)(iVar19 << 2));
          fVar227 = auVar80._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar263 = ZEXT1664(auVar263._0_16_);
            auVar269 = ZEXT1664(auVar269._0_16_);
            auVar270 = ZEXT1664(auVar270._0_16_);
            fVar227 = sqrtf((float)local_7e0._0_4_);
          }
          auVar258 = ZEXT464(uVar139);
          auVar14 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar74 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar15 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar75 = vminps_avx(auVar14,auVar15);
          auVar14 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar15 = vmaxps_avx(auVar74,auVar14);
          auVar210._8_4_ = 0x7fffffff;
          auVar210._0_8_ = 0x7fffffff7fffffff;
          auVar210._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar75,auVar210);
          auVar14 = vandps_avx(auVar15,auVar210);
          auVar74 = vmaxps_avx(auVar74,auVar14);
          auVar14 = vmovshdup_avx(auVar74);
          auVar14 = vmaxss_avx(auVar14,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar14);
          fVar198 = auVar74._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar15,auVar15,0xff);
          auVar74 = vinsertps_avx(ZEXT416(uVar139),ZEXT416(uVar73),0x10);
          auVar243 = ZEXT1664(auVar74);
          lVar70 = 5;
          do {
            do {
              bVar71 = lVar70 == 0;
              lVar70 = lVar70 + -1;
              if (bVar71) goto LAB_017f4ce3;
              uVar164 = auVar243._0_4_;
              auVar152._4_4_ = uVar164;
              auVar152._0_4_ = uVar164;
              auVar152._8_4_ = uVar164;
              auVar152._12_4_ = uVar164;
              auVar74 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_7d0);
              auVar14 = vmovshdup_avx(auVar243._0_16_);
              fVar250 = auVar14._0_4_;
              fVar226 = 1.0 - fVar250;
              fVar221 = fVar250 * fVar250;
              auVar76 = SUB6416(ZEXT464(0x40400000),0);
              auVar81 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar75 = vfmadd213ss_fma(auVar76,auVar14,auVar81);
              auVar15 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar221),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar226),auVar81);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar226 * fVar226)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar222 = fVar226 * fVar226 * -fVar250 * 0.5;
              fVar223 = auVar15._0_4_ * 0.5;
              fVar224 = auVar85._0_4_ * 0.5;
              fVar225 = fVar250 * fVar250 * -fVar226 * 0.5;
              auVar211._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar211._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar211._8_4_ = fVar225 * fStack_7b8;
              auVar211._12_4_ = fVar225 * fStack_7b4;
              auVar232._4_4_ = fVar224;
              auVar232._0_4_ = fVar224;
              auVar232._8_4_ = fVar224;
              auVar232._12_4_ = fVar224;
              auVar15 = vfmadd132ps_fma(auVar232,auVar211,local_780._0_16_);
              auVar190._4_4_ = fVar223;
              auVar190._0_4_ = fVar223;
              auVar190._8_4_ = fVar223;
              auVar190._12_4_ = fVar223;
              auVar15 = vfmadd132ps_fma(auVar190,auVar15,local_7a0._0_16_);
              auVar212._4_4_ = fVar222;
              auVar212._0_4_ = fVar222;
              auVar212._8_4_ = fVar222;
              auVar212._12_4_ = fVar222;
              auVar15 = vfmadd132ps_fma(auVar212,auVar15,local_760._0_16_);
              auVar85 = vfmadd231ss_fma(auVar81,auVar14,ZEXT416(0x41100000));
              local_640._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar14,ZEXT416(0x40800000));
              local_660._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(auVar76,auVar14,ZEXT416(0xbf800000));
              local_680._0_16_ = auVar85;
              _local_620 = auVar15;
              auVar15 = vsubps_avx(auVar74,auVar15);
              auVar74 = vdpps_avx(auVar15,auVar15,0x7f);
              fVar222 = auVar74._0_4_;
              local_740 = auVar243._0_32_;
              if (fVar222 < 0.0) {
                local_860._0_4_ = auVar75._0_4_;
                local_880._0_16_ = ZEXT416((uint)fVar226);
                local_800._0_4_ = fVar221;
                local_820._0_4_ = fVar226 * -2.0;
                auVar270._0_4_ = sqrtf(fVar222);
                auVar270._4_60_ = extraout_var_00;
                auVar75 = ZEXT416((uint)local_860._0_4_);
                auVar85 = auVar270._0_16_;
                auVar81 = local_880._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar74,auVar74);
                local_820._0_4_ = fVar226 * -2.0;
                local_800._0_4_ = fVar221;
                auVar81 = ZEXT416((uint)fVar226);
              }
              fVar221 = auVar81._0_4_;
              auVar82 = vfnmadd231ss_fma(ZEXT416((uint)(fVar250 * (fVar221 + fVar221))),auVar81,
                                         auVar81);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar250 + fVar250)),
                                        ZEXT416((uint)(fVar250 * fVar250 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar14,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221 * -3.0)),
                                        ZEXT416((uint)(fVar221 + fVar221)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar14,
                                        ZEXT416((uint)local_800._0_4_));
              fVar221 = auVar82._0_4_ * 0.5;
              fVar223 = auVar75._0_4_ * 0.5;
              fVar224 = auVar76._0_4_ * 0.5;
              fVar225 = auVar81._0_4_ * 0.5;
              auVar213._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar213._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar213._8_4_ = fVar225 * fStack_7b8;
              auVar213._12_4_ = fVar225 * fStack_7b4;
              auVar191._4_4_ = fVar224;
              auVar191._0_4_ = fVar224;
              auVar191._8_4_ = fVar224;
              auVar191._12_4_ = fVar224;
              auVar75 = vfmadd132ps_fma(auVar191,auVar213,local_780._0_16_);
              auVar173._4_4_ = fVar223;
              auVar173._0_4_ = fVar223;
              auVar173._8_4_ = fVar223;
              auVar173._12_4_ = fVar223;
              auVar75 = vfmadd132ps_fma(auVar173,auVar75,local_7a0._0_16_);
              auVar273._4_4_ = fVar221;
              auVar273._0_4_ = fVar221;
              auVar273._8_4_ = fVar221;
              auVar273._12_4_ = fVar221;
              local_860._0_16_ = vfmadd132ps_fma(auVar273,auVar75,local_760._0_16_);
              local_800._0_16_ = vdpps_avx(local_860._0_16_,local_860._0_16_,0x7f);
              auVar50._12_4_ = 0;
              auVar50._0_12_ = ZEXT812(0);
              fVar221 = local_800._0_4_;
              auVar75 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar221));
              fVar223 = auVar75._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar221));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_800._0_16_,auVar25);
              auVar75 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_6a0._0_4_ = auVar75._0_4_;
              local_880._0_4_ = auVar85._0_4_;
              if (fVar221 < auVar81._0_4_) {
                fVar224 = sqrtf(fVar221);
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar75 = local_860._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar224 = auVar75._0_4_;
                auVar75 = local_860._0_16_;
              }
              fVar221 = fVar223 * 1.5 + fVar221 * -0.5 * fVar223 * fVar223 * fVar223;
              auVar233._0_4_ = auVar75._0_4_ * fVar221;
              auVar233._4_4_ = auVar75._4_4_ * fVar221;
              auVar233._8_4_ = auVar75._8_4_ * fVar221;
              auVar233._12_4_ = auVar75._12_4_ * fVar221;
              auVar81 = vdpps_avx(auVar15,auVar233,0x7f);
              fVar226 = auVar85._0_4_;
              fVar223 = auVar81._0_4_;
              auVar153._0_4_ = fVar223 * fVar223;
              auVar153._4_4_ = auVar81._4_4_ * auVar81._4_4_;
              auVar153._8_4_ = auVar81._8_4_ * auVar81._8_4_;
              auVar153._12_4_ = auVar81._12_4_ * auVar81._12_4_;
              auVar76 = vsubps_avx512vl(auVar74,auVar153);
              fVar225 = auVar76._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar225;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar83 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
              if (fVar225 < 0.0) {
                local_6d0 = fVar221;
                fStack_6cc = fVar221;
                fStack_6c8 = fVar221;
                fStack_6c4 = fVar221;
                local_6c0 = auVar233;
                local_6b0 = auVar82;
                fVar225 = sqrtf(fVar225);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar233 = local_6c0;
                auVar76 = local_6b0;
                auVar75 = local_860._0_16_;
                fVar221 = local_6d0;
                fVar250 = fStack_6cc;
                fVar251 = fStack_6c8;
                fVar252 = fStack_6c4;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
                fVar225 = auVar76._0_4_;
                auVar76 = auVar82;
                fVar250 = fVar221;
                fVar251 = fVar221;
                fVar252 = fVar221;
              }
              auVar269 = ZEXT1664(auVar15);
              auVar175._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
              auVar175._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
              auVar175._8_4_ = (float)local_680._0_4_ * fStack_7b8;
              auVar175._12_4_ = (float)local_680._0_4_ * fStack_7b4;
              auVar192._4_4_ = local_660._0_4_;
              auVar192._0_4_ = local_660._0_4_;
              auVar192._8_4_ = local_660._0_4_;
              auVar192._12_4_ = local_660._0_4_;
              auVar78 = vfmadd132ps_fma(auVar192,auVar175,local_780._0_16_);
              auVar176._4_4_ = local_640._0_4_;
              auVar176._0_4_ = local_640._0_4_;
              auVar176._8_4_ = local_640._0_4_;
              auVar176._12_4_ = local_640._0_4_;
              auVar78 = vfmadd132ps_fma(auVar176,auVar78,local_7a0._0_16_);
              auVar14 = vfmadd213ss_fma(auVar14,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar164 = auVar14._0_4_;
              auVar193._4_4_ = uVar164;
              auVar193._0_4_ = uVar164;
              auVar193._8_4_ = uVar164;
              auVar193._12_4_ = uVar164;
              auVar14 = vfmadd132ps_fma(auVar193,auVar78,local_760._0_16_);
              auVar177._0_4_ = auVar14._0_4_ * (float)local_800._0_4_;
              auVar177._4_4_ = auVar14._4_4_ * (float)local_800._0_4_;
              auVar177._8_4_ = auVar14._8_4_ * (float)local_800._0_4_;
              auVar177._12_4_ = auVar14._12_4_ * (float)local_800._0_4_;
              auVar14 = vdpps_avx(auVar75,auVar14,0x7f);
              fVar182 = auVar14._0_4_;
              auVar194._0_4_ = auVar75._0_4_ * fVar182;
              auVar194._4_4_ = auVar75._4_4_ * fVar182;
              auVar194._8_4_ = auVar75._8_4_ * fVar182;
              auVar194._12_4_ = auVar75._12_4_ * fVar182;
              auVar14 = vsubps_avx(auVar177,auVar194);
              fVar182 = (float)local_6a0._0_4_ * (float)local_820._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar198),
                                   ZEXT416((uint)(local_740._0_4_ * fVar227 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar75,auVar26);
              auVar195._0_4_ = fVar221 * auVar14._0_4_ * fVar182;
              auVar195._4_4_ = fVar250 * auVar14._4_4_ * fVar182;
              auVar195._8_4_ = fVar251 * auVar14._8_4_ * fVar182;
              auVar195._12_4_ = fVar252 * auVar14._12_4_ * fVar182;
              auVar14 = vdpps_avx(auVar84,auVar233,0x7f);
              auVar77 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar198),auVar78);
              auVar85 = vdpps_avx(auVar15,auVar195,0x7f);
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                        ZEXT416((uint)(fVar198 / fVar224)),auVar77);
              fVar221 = auVar14._0_4_ + auVar85._0_4_;
              auVar270 = ZEXT464((uint)fVar221);
              auVar14 = vdpps_avx(local_7d0,auVar233,0x7f);
              auVar85 = vdpps_avx(auVar15,auVar84,0x7f);
              auVar83 = vmulss_avx512f(auVar83,auVar76);
              fVar224 = auVar82._0_4_ * 1.5 + auVar83._0_4_ * auVar76._0_4_ * auVar76._0_4_;
              auVar76 = vdpps_avx(auVar15,local_7d0,0x7f);
              auVar83 = vfnmadd231ss_fma(auVar85,auVar81,ZEXT416((uint)fVar221));
              auVar76 = vfnmadd231ss_fma(auVar76,auVar81,auVar14);
              auVar85 = vpermilps_avx(_local_620,0xff);
              fVar225 = fVar225 - auVar85._0_4_;
              auVar82 = vshufps_avx(auVar75,auVar75,0xff);
              auVar85 = vfmsub213ss_fma(auVar83,ZEXT416((uint)fVar224),auVar82);
              auVar261._8_4_ = 0x80000000;
              auVar261._0_8_ = 0x8000000080000000;
              auVar261._12_4_ = 0x80000000;
              auVar263 = ZEXT1664(auVar261);
              auVar256._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar258 = ZEXT1664(auVar256);
              auVar76 = ZEXT416((uint)(auVar76._0_4_ * fVar224));
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar221),auVar76);
              auVar85 = vinsertps_avx(auVar256,auVar76,0x1c);
              auVar240._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = auVar14._8_4_ ^ 0x80000000;
              auVar240._12_4_ = auVar14._12_4_ ^ 0x80000000;
              auVar76 = vinsertps_avx(ZEXT416((uint)fVar221),auVar240,0x10);
              auVar214._0_4_ = auVar83._0_4_;
              auVar214._4_4_ = auVar214._0_4_;
              auVar214._8_4_ = auVar214._0_4_;
              auVar214._12_4_ = auVar214._0_4_;
              auVar14 = vdivps_avx(auVar85,auVar214);
              auVar85 = vdivps_avx(auVar76,auVar214);
              auVar215._0_4_ = fVar223 * auVar14._0_4_ + fVar225 * auVar85._0_4_;
              auVar215._4_4_ = fVar223 * auVar14._4_4_ + fVar225 * auVar85._4_4_;
              auVar215._8_4_ = fVar223 * auVar14._8_4_ + fVar225 * auVar85._8_4_;
              auVar215._12_4_ = fVar223 * auVar14._12_4_ + fVar225 * auVar85._12_4_;
              auVar14 = vsubps_avx(local_740._0_16_,auVar215);
              auVar243 = ZEXT1664(auVar14);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(auVar81,auVar27);
            } while (auVar77._0_4_ <= auVar85._0_4_);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ + auVar78._0_4_)),local_6e0,
                                      ZEXT416(0x36000000));
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar28);
          } while (auVar85._0_4_ <= auVar81._0_4_);
          fVar227 = auVar14._0_4_ + (float)local_6f0._0_4_;
          if ((fVar146 <= fVar227) &&
             (fVar198 = *(float *)(ray + k * 4 + 0x100), fVar227 <= fVar198)) {
            auVar85 = vmovshdup_avx(auVar14);
            fVar223 = auVar85._0_4_;
            if ((0.0 <= fVar223) && (fVar223 <= 1.0)) {
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT412(0);
              auVar138._16_16_ = auVar136._16_16_;
              auVar138._4_12_ = ZEXT412(0);
              auVar138._0_4_ = fVar222;
              auVar85 = vrsqrt14ss_avx512f(auVar51 << 0x20,auVar138._0_16_);
              fVar222 = auVar85._0_4_;
              auVar74 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
              pGVar4 = (context->scene->geometries).items[uVar1].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar222 = fVar222 * 1.5 + auVar74._0_4_ * fVar222 * fVar222 * fVar222;
                auVar216._0_4_ = auVar15._0_4_ * fVar222;
                auVar216._4_4_ = auVar15._4_4_ * fVar222;
                auVar216._8_4_ = auVar15._8_4_ * fVar222;
                auVar216._12_4_ = auVar15._12_4_ * fVar222;
                auVar81 = vfmadd213ps_fma(auVar82,auVar216,auVar75);
                auVar74 = vshufps_avx(auVar216,auVar216,0xc9);
                auVar85 = vshufps_avx(auVar75,auVar75,0xc9);
                auVar217._0_4_ = auVar216._0_4_ * auVar85._0_4_;
                auVar217._4_4_ = auVar216._4_4_ * auVar85._4_4_;
                auVar217._8_4_ = auVar216._8_4_ * auVar85._8_4_;
                auVar217._12_4_ = auVar216._12_4_ * auVar85._12_4_;
                auVar85 = vfmsub231ps_fma(auVar217,auVar75,auVar74);
                auVar74 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar75 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                auVar154._0_4_ = auVar81._0_4_ * auVar85._0_4_;
                auVar154._4_4_ = auVar81._4_4_ * auVar85._4_4_;
                auVar154._8_4_ = auVar81._8_4_ * auVar85._8_4_;
                auVar154._12_4_ = auVar81._12_4_ * auVar85._12_4_;
                auVar74 = vfmsub231ps_fma(auVar154,auVar74,auVar75);
                uVar164 = auVar74._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  uVar3 = vextractps_avx(auVar74,1);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                  uVar3 = vextractps_avx(auVar74,2);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar164;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar223;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = uVar2;
                  *(uint *)(ray + k * 4 + 0x240) = uVar1;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  pRVar6 = context->user;
                  auVar219._8_4_ = 1;
                  auVar219._0_8_ = 0x100000001;
                  auVar219._12_4_ = 1;
                  auVar219._16_4_ = 1;
                  auVar219._20_4_ = 1;
                  auVar219._24_4_ = 1;
                  auVar219._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar219,ZEXT1632(auVar14));
                  auVar97 = vpermps_avx2(auVar219,ZEXT1632(auVar74));
                  auVar236._8_4_ = 2;
                  auVar236._0_8_ = 0x200000002;
                  auVar236._12_4_ = 2;
                  auVar236._16_4_ = 2;
                  auVar236._20_4_ = 2;
                  auVar236._24_4_ = 2;
                  auVar236._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar236,ZEXT1632(auVar74));
                  local_4a0[0] = (RTCHitN)auVar97[0];
                  local_4a0[1] = (RTCHitN)auVar97[1];
                  local_4a0[2] = (RTCHitN)auVar97[2];
                  local_4a0[3] = (RTCHitN)auVar97[3];
                  local_4a0[4] = (RTCHitN)auVar97[4];
                  local_4a0[5] = (RTCHitN)auVar97[5];
                  local_4a0[6] = (RTCHitN)auVar97[6];
                  local_4a0[7] = (RTCHitN)auVar97[7];
                  local_4a0[8] = (RTCHitN)auVar97[8];
                  local_4a0[9] = (RTCHitN)auVar97[9];
                  local_4a0[10] = (RTCHitN)auVar97[10];
                  local_4a0[0xb] = (RTCHitN)auVar97[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar97[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar97[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar97[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar97[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar97[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar97[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar97[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar97[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar97[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar97[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar97[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar97[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar97[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar97[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar97[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar97[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar97[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar97[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar97[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar97[0x1f];
                  local_460 = uVar164;
                  uStack_45c = uVar164;
                  uStack_458 = uVar164;
                  uStack_454 = uVar164;
                  uStack_450 = uVar164;
                  uStack_44c = uVar164;
                  uStack_448 = uVar164;
                  uStack_444 = uVar164;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_500._0_8_;
                  uStack_3f8 = local_500._8_8_;
                  uStack_3f0 = local_500._16_8_;
                  uStack_3e8 = local_500._24_8_;
                  local_3e0 = local_4e0;
                  auVar97 = vpcmpeqd_avx2(local_4e0,local_4e0);
                  local_838[1] = auVar97;
                  *local_838 = auVar97;
                  local_3c0 = pRVar6->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar6->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  local_720 = local_540;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_4a0;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar258 = ZEXT1664(auVar256);
                    auVar263 = ZEXT1664(auVar261);
                    auVar269 = ZEXT1664(auVar15);
                    auVar270 = ZEXT1664(ZEXT416((uint)fVar221));
                    (*pGVar4->intersectionFilterN)(&local_8b0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      (*p_Var5)(&local_8b0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      iVar52 = *(int *)(local_8b0.hit + 4);
                      iVar53 = *(int *)(local_8b0.hit + 8);
                      iVar54 = *(int *)(local_8b0.hit + 0xc);
                      iVar55 = *(int *)(local_8b0.hit + 0x10);
                      iVar56 = *(int *)(local_8b0.hit + 0x14);
                      iVar57 = *(int *)(local_8b0.hit + 0x18);
                      iVar58 = *(int *)(local_8b0.hit + 0x1c);
                      bVar63 = (byte)uVar72;
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x180) =
                           (uint)(bVar63 & 1) * *(int *)local_8b0.hit |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_8b0.ray + 0x180);
                      *(uint *)(local_8b0.ray + 0x184) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x184);
                      *(uint *)(local_8b0.ray + 0x188) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x188);
                      *(uint *)(local_8b0.ray + 0x18c) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x18c);
                      *(uint *)(local_8b0.ray + 400) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 400);
                      *(uint *)(local_8b0.ray + 0x194) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x194);
                      *(uint *)(local_8b0.ray + 0x198) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x198);
                      *(uint *)(local_8b0.ray + 0x19c) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x19c);
                      iVar52 = *(int *)(local_8b0.hit + 0x24);
                      iVar53 = *(int *)(local_8b0.hit + 0x28);
                      iVar54 = *(int *)(local_8b0.hit + 0x2c);
                      iVar55 = *(int *)(local_8b0.hit + 0x30);
                      iVar56 = *(int *)(local_8b0.hit + 0x34);
                      iVar57 = *(int *)(local_8b0.hit + 0x38);
                      iVar58 = *(int *)(local_8b0.hit + 0x3c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1a0) =
                           (uint)(bVar63 & 1) * *(int *)(local_8b0.hit + 0x20) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_8b0.ray + 0x1a0);
                      *(uint *)(local_8b0.ray + 0x1a4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1a4);
                      *(uint *)(local_8b0.ray + 0x1a8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1a8);
                      *(uint *)(local_8b0.ray + 0x1ac) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1ac);
                      *(uint *)(local_8b0.ray + 0x1b0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1b0);
                      *(uint *)(local_8b0.ray + 0x1b4) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x1b4);
                      *(uint *)(local_8b0.ray + 0x1b8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1b8);
                      *(uint *)(local_8b0.ray + 0x1bc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1bc);
                      iVar52 = *(int *)(local_8b0.hit + 0x44);
                      iVar53 = *(int *)(local_8b0.hit + 0x48);
                      iVar54 = *(int *)(local_8b0.hit + 0x4c);
                      iVar55 = *(int *)(local_8b0.hit + 0x50);
                      iVar56 = *(int *)(local_8b0.hit + 0x54);
                      iVar57 = *(int *)(local_8b0.hit + 0x58);
                      iVar58 = *(int *)(local_8b0.hit + 0x5c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1c0) =
                           (uint)(bVar63 & 1) * *(int *)(local_8b0.hit + 0x40) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_8b0.ray + 0x1c0);
                      *(uint *)(local_8b0.ray + 0x1c4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1c4);
                      *(uint *)(local_8b0.ray + 0x1c8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1c8);
                      *(uint *)(local_8b0.ray + 0x1cc) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1cc);
                      *(uint *)(local_8b0.ray + 0x1d0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1d0);
                      *(uint *)(local_8b0.ray + 0x1d4) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x1d4);
                      *(uint *)(local_8b0.ray + 0x1d8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1d8);
                      *(uint *)(local_8b0.ray + 0x1dc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1dc);
                      iVar52 = *(int *)(local_8b0.hit + 100);
                      iVar53 = *(int *)(local_8b0.hit + 0x68);
                      iVar54 = *(int *)(local_8b0.hit + 0x6c);
                      iVar55 = *(int *)(local_8b0.hit + 0x70);
                      iVar56 = *(int *)(local_8b0.hit + 0x74);
                      iVar57 = *(int *)(local_8b0.hit + 0x78);
                      iVar58 = *(int *)(local_8b0.hit + 0x7c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x1e0) =
                           (uint)(bVar63 & 1) * *(int *)(local_8b0.hit + 0x60) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_8b0.ray + 0x1e0);
                      *(uint *)(local_8b0.ray + 0x1e4) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x1e4);
                      *(uint *)(local_8b0.ray + 0x1e8) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x1e8);
                      *(uint *)(local_8b0.ray + 0x1ec) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x1ec);
                      *(uint *)(local_8b0.ray + 0x1f0) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x1f0);
                      *(uint *)(local_8b0.ray + 500) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 500);
                      *(uint *)(local_8b0.ray + 0x1f8) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x1f8);
                      *(uint *)(local_8b0.ray + 0x1fc) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x1fc);
                      iVar52 = *(int *)(local_8b0.hit + 0x84);
                      iVar53 = *(int *)(local_8b0.hit + 0x88);
                      iVar54 = *(int *)(local_8b0.hit + 0x8c);
                      iVar55 = *(int *)(local_8b0.hit + 0x90);
                      iVar56 = *(int *)(local_8b0.hit + 0x94);
                      iVar57 = *(int *)(local_8b0.hit + 0x98);
                      iVar58 = *(int *)(local_8b0.hit + 0x9c);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar12 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_8b0.ray + 0x200) =
                           (uint)(bVar63 & 1) * *(int *)(local_8b0.hit + 0x80) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_8b0.ray + 0x200);
                      *(uint *)(local_8b0.ray + 0x204) =
                           (uint)bVar71 * iVar52 | (uint)!bVar71 * *(int *)(local_8b0.ray + 0x204);
                      *(uint *)(local_8b0.ray + 0x208) =
                           (uint)bVar7 * iVar53 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x208);
                      *(uint *)(local_8b0.ray + 0x20c) =
                           (uint)bVar8 * iVar54 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x20c);
                      *(uint *)(local_8b0.ray + 0x210) =
                           (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_8b0.ray + 0x210);
                      *(uint *)(local_8b0.ray + 0x214) =
                           (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_8b0.ray + 0x214);
                      *(uint *)(local_8b0.ray + 0x218) =
                           (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_8b0.ray + 0x218);
                      *(uint *)(local_8b0.ray + 0x21c) =
                           (uint)bVar12 * iVar58 | (uint)!bVar12 * *(int *)(local_8b0.ray + 0x21c);
                      auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar97;
                      auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar97;
                      auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar97;
                      auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar97;
                      goto LAB_017f4ce3;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar198;
                }
              }
            }
          }
LAB_017f4ce3:
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar242._4_4_ = uVar164;
          auVar242._0_4_ = uVar164;
          auVar242._8_4_ = uVar164;
          auVar242._12_4_ = uVar164;
          auVar242._16_4_ = uVar164;
          auVar242._20_4_ = uVar164;
          auVar242._24_4_ = uVar164;
          auVar242._28_4_ = uVar164;
          auVar243 = ZEXT3264(auVar242);
          auVar60._4_4_ = fStack_57c;
          auVar60._0_4_ = local_580;
          auVar60._8_4_ = fStack_578;
          auVar60._12_4_ = fStack_574;
          auVar60._16_4_ = fStack_570;
          auVar60._20_4_ = fStack_56c;
          auVar60._24_4_ = fStack_568;
          auVar60._28_4_ = fStack_564;
          uVar16 = vcmpps_avx512vl(auVar242,auVar60,0xd);
        }
        uVar18 = vpcmpd_avx512vl(local_520,local_340,1);
        uVar17 = vpcmpd_avx512vl(local_520,_local_5a0,1);
        auVar181._0_4_ = (float)local_5c0._0_4_ + (float)local_200._0_4_;
        auVar181._4_4_ = (float)local_5c0._4_4_ + (float)local_200._4_4_;
        auVar181._8_4_ = fStack_5b8 + fStack_1f8;
        auVar181._12_4_ = fStack_5b4 + fStack_1f4;
        auVar181._16_4_ = fStack_5b0 + fStack_1f0;
        auVar181._20_4_ = fStack_5ac + fStack_1ec;
        auVar181._24_4_ = fStack_5a8 + fStack_1e8;
        auVar181._28_4_ = fStack_5a4 + fStack_1e4;
        uVar164 = auVar243._0_4_;
        auVar197._4_4_ = uVar164;
        auVar197._0_4_ = uVar164;
        auVar197._8_4_ = uVar164;
        auVar197._12_4_ = uVar164;
        auVar197._16_4_ = uVar164;
        auVar197._20_4_ = uVar164;
        auVar197._24_4_ = uVar164;
        auVar197._28_4_ = uVar164;
        uVar16 = vcmpps_avx512vl(auVar181,auVar197,2);
        bVar66 = bVar66 & (byte)uVar18 & (byte)uVar16;
        auVar220._0_4_ = (float)local_5c0._0_4_ + (float)local_380._0_4_;
        auVar220._4_4_ = (float)local_5c0._4_4_ + (float)local_380._4_4_;
        auVar220._8_4_ = fStack_5b8 + fStack_378;
        auVar220._12_4_ = fStack_5b4 + fStack_374;
        auVar220._16_4_ = fStack_5b0 + fStack_370;
        auVar220._20_4_ = fStack_5ac + fStack_36c;
        auVar220._24_4_ = fStack_5a8 + fStack_368;
        auVar220._28_4_ = fStack_5a4 + fStack_364;
        uVar16 = vcmpps_avx512vl(auVar220,auVar197,2);
        bVar62 = bVar62 & (byte)uVar17 & (byte)uVar16 | bVar66;
        if (bVar62 != 0) {
          abStack_180[uVar67 * 0x60] = bVar62;
          bVar71 = (bool)(bVar66 >> 1 & 1);
          bVar7 = (bool)(bVar66 >> 2 & 1);
          bVar8 = (bool)(bVar66 >> 3 & 1);
          bVar9 = (bool)(bVar66 >> 4 & 1);
          bVar10 = (bool)(bVar66 >> 5 & 1);
          auStack_160[uVar67 * 0x18] =
               (uint)(bVar66 & 1) * local_200._0_4_ | (uint)!(bool)(bVar66 & 1) * local_380._0_4_;
          auStack_160[uVar67 * 0x18 + 1] =
               (uint)bVar71 * local_200._4_4_ | (uint)!bVar71 * local_380._4_4_;
          auStack_160[uVar67 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)fStack_378;
          auStack_160[uVar67 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_1f4 | (uint)!bVar8 * (int)fStack_374;
          auStack_160[uVar67 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_1f0 | (uint)!bVar9 * (int)fStack_370;
          auStack_160[uVar67 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_1ec | (uint)!bVar10 * (int)fStack_36c;
          auStack_160[uVar67 * 0x18 + 6] =
               (uint)(bVar66 >> 6) * (int)fStack_1e8 | (uint)!(bool)(bVar66 >> 6) * (int)fStack_368;
          (&fStack_144)[uVar67 * 0x18] = fStack_364;
          uVar72 = vmovlps_avx(local_550);
          (&uStack_140)[uVar67 * 0xc] = uVar72;
          aiStack_138[uVar67 * 0x18] = local_b04 + 1;
          uVar67 = (ulong)((int)uVar67 + 1);
        }
        auVar243 = ZEXT3264(_DAT_01f7b040);
        prim = local_830;
      }
    }
    do {
      uVar73 = (uint)uVar67;
      uVar67 = (ulong)(uVar73 - 1);
      if (uVar73 == 0) {
        uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar29._4_4_ = uVar164;
        auVar29._0_4_ = uVar164;
        auVar29._8_4_ = uVar164;
        auVar29._12_4_ = uVar164;
        uVar16 = vcmpps_avx512vl(local_560,auVar29,2);
        local_828 = (ulong)((uint)local_828 & (uint)uVar16);
        goto LAB_017f2594;
      }
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x18);
      auVar178._0_4_ = auVar97._0_4_ + (float)local_5c0._0_4_;
      auVar178._4_4_ = auVar97._4_4_ + (float)local_5c0._4_4_;
      auVar178._8_4_ = auVar97._8_4_ + fStack_5b8;
      auVar178._12_4_ = auVar97._12_4_ + fStack_5b4;
      auVar178._16_4_ = auVar97._16_4_ + fStack_5b0;
      auVar178._20_4_ = auVar97._20_4_ + fStack_5ac;
      auVar178._24_4_ = auVar97._24_4_ + fStack_5a8;
      auVar178._28_4_ = auVar97._28_4_ + fStack_5a4;
      uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar164;
      auVar36._0_4_ = uVar164;
      auVar36._8_4_ = uVar164;
      auVar36._12_4_ = uVar164;
      auVar36._16_4_ = uVar164;
      auVar36._20_4_ = uVar164;
      auVar36._24_4_ = uVar164;
      auVar36._28_4_ = uVar164;
      uVar16 = vcmpps_avx512vl(auVar178,auVar36,2);
      uVar139 = (uint)uVar16 & (uint)abStack_180[uVar67 * 0x60];
    } while (uVar139 == 0);
    uVar72 = (&uStack_140)[uVar67 * 0xc];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar72;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar100 = vblendmps_avx512vl(auVar196,auVar97);
    bVar62 = (byte)uVar139;
    auVar134._0_4_ =
         (uint)(bVar62 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar97._0_4_;
    bVar71 = (bool)((byte)(uVar139 >> 1) & 1);
    auVar134._4_4_ = (uint)bVar71 * auVar100._4_4_ | (uint)!bVar71 * (int)auVar97._4_4_;
    bVar71 = (bool)((byte)(uVar139 >> 2) & 1);
    auVar134._8_4_ = (uint)bVar71 * auVar100._8_4_ | (uint)!bVar71 * (int)auVar97._8_4_;
    bVar71 = (bool)((byte)(uVar139 >> 3) & 1);
    auVar134._12_4_ = (uint)bVar71 * auVar100._12_4_ | (uint)!bVar71 * (int)auVar97._12_4_;
    bVar71 = (bool)((byte)(uVar139 >> 4) & 1);
    auVar134._16_4_ = (uint)bVar71 * auVar100._16_4_ | (uint)!bVar71 * (int)auVar97._16_4_;
    bVar71 = (bool)((byte)(uVar139 >> 5) & 1);
    auVar134._20_4_ = (uint)bVar71 * auVar100._20_4_ | (uint)!bVar71 * (int)auVar97._20_4_;
    bVar71 = (bool)((byte)(uVar139 >> 6) & 1);
    auVar134._24_4_ = (uint)bVar71 * auVar100._24_4_ | (uint)!bVar71 * (int)auVar97._24_4_;
    auVar134._28_4_ =
         (uVar139 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar139 >> 7,0) * (int)auVar97._28_4_;
    auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar97 = vminps_avx(auVar134,auVar97);
    auVar100 = vshufpd_avx(auVar97,auVar97,5);
    auVar97 = vminps_avx(auVar97,auVar100);
    auVar100 = vpermpd_avx2(auVar97,0x4e);
    auVar97 = vminps_avx(auVar97,auVar100);
    uVar16 = vcmpps_avx512vl(auVar134,auVar97,0);
    bVar68 = (byte)uVar16 & bVar62;
    if (bVar68 != 0) {
      uVar139 = (uint)bVar68;
    }
    uVar140 = 0;
    for (; (uVar139 & 1) == 0; uVar139 = uVar139 >> 1 | 0x80000000) {
      uVar140 = uVar140 + 1;
    }
    local_b04 = aiStack_138[uVar67 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar140 & 0x1f)) & bVar62;
    abStack_180[uVar67 * 0x60] = bVar62;
    if (bVar62 == 0) {
      uVar73 = uVar73 - 1;
    }
    uVar164 = (undefined4)uVar72;
    auVar158._4_4_ = uVar164;
    auVar158._0_4_ = uVar164;
    auVar158._8_4_ = uVar164;
    auVar158._12_4_ = uVar164;
    auVar158._16_4_ = uVar164;
    auVar158._20_4_ = uVar164;
    auVar158._24_4_ = uVar164;
    auVar158._28_4_ = uVar164;
    auVar74 = vmovshdup_avx(auVar167);
    auVar74 = vsubps_avx(auVar74,auVar167);
    auVar179._0_4_ = auVar74._0_4_;
    auVar179._4_4_ = auVar179._0_4_;
    auVar179._8_4_ = auVar179._0_4_;
    auVar179._12_4_ = auVar179._0_4_;
    auVar179._16_4_ = auVar179._0_4_;
    auVar179._20_4_ = auVar179._0_4_;
    auVar179._24_4_ = auVar179._0_4_;
    auVar179._28_4_ = auVar179._0_4_;
    auVar74 = vfmadd132ps_fma(auVar179,auVar158,auVar243._0_32_);
    auVar97 = ZEXT1632(auVar74);
    local_4a0[0] = (RTCHitN)auVar97[0];
    local_4a0[1] = (RTCHitN)auVar97[1];
    local_4a0[2] = (RTCHitN)auVar97[2];
    local_4a0[3] = (RTCHitN)auVar97[3];
    local_4a0[4] = (RTCHitN)auVar97[4];
    local_4a0[5] = (RTCHitN)auVar97[5];
    local_4a0[6] = (RTCHitN)auVar97[6];
    local_4a0[7] = (RTCHitN)auVar97[7];
    local_4a0[8] = (RTCHitN)auVar97[8];
    local_4a0[9] = (RTCHitN)auVar97[9];
    local_4a0[10] = (RTCHitN)auVar97[10];
    local_4a0[0xb] = (RTCHitN)auVar97[0xb];
    local_4a0[0xc] = (RTCHitN)auVar97[0xc];
    local_4a0[0xd] = (RTCHitN)auVar97[0xd];
    local_4a0[0xe] = (RTCHitN)auVar97[0xe];
    local_4a0[0xf] = (RTCHitN)auVar97[0xf];
    local_4a0[0x10] = (RTCHitN)auVar97[0x10];
    local_4a0[0x11] = (RTCHitN)auVar97[0x11];
    local_4a0[0x12] = (RTCHitN)auVar97[0x12];
    local_4a0[0x13] = (RTCHitN)auVar97[0x13];
    local_4a0[0x14] = (RTCHitN)auVar97[0x14];
    local_4a0[0x15] = (RTCHitN)auVar97[0x15];
    local_4a0[0x16] = (RTCHitN)auVar97[0x16];
    local_4a0[0x17] = (RTCHitN)auVar97[0x17];
    local_4a0[0x18] = (RTCHitN)auVar97[0x18];
    local_4a0[0x19] = (RTCHitN)auVar97[0x19];
    local_4a0[0x1a] = (RTCHitN)auVar97[0x1a];
    local_4a0[0x1b] = (RTCHitN)auVar97[0x1b];
    local_4a0[0x1c] = (RTCHitN)auVar97[0x1c];
    local_4a0[0x1d] = (RTCHitN)auVar97[0x1d];
    local_4a0[0x1e] = (RTCHitN)auVar97[0x1e];
    local_4a0[0x1f] = (RTCHitN)auVar97[0x1f];
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar140 * 4);
    uVar67 = (ulong)uVar73;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }